

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  RTCRayQueryContext *pRVar5;
  RTCIntersectArguments RVar6;
  size_t k;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [28];
  uint uVar66;
  int iVar67;
  AABBNodeMB4D *node1;
  ulong uVar68;
  ulong uVar69;
  undefined4 uVar70;
  RTCIntersectArguments *pRVar71;
  RTCIntersectArguments *pRVar72;
  ulong uVar73;
  undefined1 (*pauVar74) [32];
  undefined1 auVar75 [8];
  ulong uVar76;
  float *vertices1;
  ulong uVar77;
  vuint<4> *v;
  RTCIntersectArguments *pRVar78;
  uint uVar79;
  ulong *puVar80;
  uint uVar81;
  NodeRef root;
  bool bVar82;
  float fVar83;
  float fVar84;
  float fVar97;
  float fVar99;
  float fVar101;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar98;
  float fVar100;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 in_ZMM1 [64];
  undefined1 auVar116 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar132;
  float fVar135;
  undefined1 auVar123 [16];
  float fVar141;
  float fVar143;
  float fVar145;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar138;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar144;
  float fVar146;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar177;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar204;
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [64];
  float fVar208;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar215 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar222;
  undefined1 auVar228 [32];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [64];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar236;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar241 [64];
  float fVar248;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar251 [64];
  float fVar258;
  undefined1 auVar259 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [64];
  float fVar267;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar270 [64];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 in_ZMM13 [64];
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 in_ZMM14 [64];
  undefined1 auVar285 [64];
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar293 [64];
  undefined1 auVar300 [36];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2e01;
  undefined1 local_2e00 [8];
  undefined1 auStack_2df8 [8];
  float fStack_2df0;
  float fStack_2dec;
  float fStack_2de8;
  float fStack_2de4;
  undefined1 local_2de0 [8];
  undefined1 auStack_2dd8 [8];
  float fStack_2dd0;
  float fStack_2dcc;
  float fStack_2dc8;
  float fStack_2dc4;
  ulong local_2da8;
  undefined1 local_2da0 [56];
  RayK<8> *local_2d68;
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [8];
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  RayK<8> *pRStack_2d28;
  undefined8 local_2d20;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float local_2d00 [4];
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  Intersectors *local_2cd0;
  RTCIntersectArguments *local_2cc8;
  undefined1 local_2cc0 [8];
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float fStack_2ca4;
  undefined1 local_2ca0 [8];
  undefined1 auStack_2c98 [8];
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  undefined1 local_2c80 [8];
  undefined1 auStack_2c78 [8];
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  float fStack_2c64;
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined1 local_2c40 [32];
  BVH *local_2c08;
  ulong local_2c00;
  ulong local_2bf8;
  ulong local_2bf0;
  RTCIntersectArguments *local_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [8];
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  undefined1 local_2b80 [8];
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined1 local_2b60 [8];
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  undefined1 local_2b40 [8];
  float fStack_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  float fStack_2b24;
  undefined1 local_2b20 [8];
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  undefined1 local_2b00 [8];
  float fStack_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  RTCIntersectArguments local_2a40;
  uint local_2a20;
  uint uStack_2a1c;
  uint uStack_2a18;
  uint uStack_2a14;
  uint uStack_2a10;
  uint uStack_2a0c;
  uint uStack_2a08;
  uint uStack_2a04;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2920;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar147 [36];
  
  local_2c08 = (BVH *)This->ptr;
  if ((local_2c08->root).ptr != 8) {
    auVar149 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar123 = ZEXT816(0) << 0x40;
    auVar91 = vpcmpeqd_avx2(auVar149,(undefined1  [32])valid_i->field_0);
    auVar149 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar123),5);
    auVar102 = auVar91 & auVar149;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0x7f,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar102 >> 0xbf,0) != '\0') ||
        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar102[0x1f] < '\0') {
      local_2cd0 = This;
      auVar149 = vandps_avx(auVar149,auVar91);
      auVar159 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
      local_2920._0_8_ = *(undefined8 *)ray;
      local_2920._8_8_ = *(undefined8 *)(ray + 8);
      local_2920._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2920._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2920._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2920._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2920._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2920._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2920._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2920._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2920._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2920._88_8_ = *(undefined8 *)(ray + 0x58);
      local_28c0 = *(undefined1 (*) [32])(ray + 0x80);
      local_28a0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2880 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2940._8_4_ = 0x7fffffff;
      local_2940._0_8_ = 0x7fffffff7fffffff;
      local_2940._12_4_ = 0x7fffffff;
      local_2940._16_4_ = 0x7fffffff;
      local_2940._20_4_ = 0x7fffffff;
      local_2940._24_4_ = 0x7fffffff;
      local_2940._28_4_ = 0x7fffffff;
      auVar251 = ZEXT3264(local_2940);
      auVar237._8_4_ = 0x219392ef;
      auVar237._0_8_ = 0x219392ef219392ef;
      auVar237._12_4_ = 0x219392ef;
      auVar237._16_4_ = 0x219392ef;
      auVar237._20_4_ = 0x219392ef;
      auVar237._24_4_ = 0x219392ef;
      auVar237._28_4_ = 0x219392ef;
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = &DAT_3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar110._16_4_ = 0x3f800000;
      auVar110._20_4_ = 0x3f800000;
      auVar110._24_4_ = 0x3f800000;
      auVar110._28_4_ = 0x3f800000;
      auVar260 = ZEXT3264(auVar110);
      auVar109 = vdivps_avx(auVar110,local_28c0);
      auVar149 = vandps_avx(local_2940,local_28c0);
      auVar102 = vcmpps_avx(auVar149,auVar237,1);
      auVar149 = vandps_avx(local_2940,local_28a0);
      auVar91 = vcmpps_avx(auVar149,auVar237,1);
      auVar215 = ZEXT3264(auVar91);
      auVar148 = vdivps_avx(auVar110,local_28a0);
      auVar149 = vandps_avx(local_2940,local_2880);
      auVar149 = vcmpps_avx(auVar149,auVar237,1);
      auVar229 = ZEXT3264(auVar149);
      auVar161 = vdivps_avx(auVar110,local_2880);
      auVar238._8_4_ = 0x5d5e0b6b;
      auVar238._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar238._12_4_ = 0x5d5e0b6b;
      auVar238._16_4_ = 0x5d5e0b6b;
      auVar238._20_4_ = 0x5d5e0b6b;
      auVar238._24_4_ = 0x5d5e0b6b;
      auVar238._28_4_ = 0x5d5e0b6b;
      local_2860 = vblendvps_avx(auVar109,auVar238,auVar102);
      _local_2840 = vblendvps_avx(auVar148,auVar238,auVar91);
      _local_2820 = vblendvps_avx(auVar161,auVar238,auVar149);
      auVar149 = vcmpps_avx(local_2860,ZEXT1632(auVar123),1);
      auVar102._8_4_ = 0x10;
      auVar102._0_8_ = 0x1000000010;
      auVar102._12_4_ = 0x10;
      auVar102._16_4_ = 0x10;
      auVar102._20_4_ = 0x10;
      auVar102._24_4_ = 0x10;
      auVar102._28_4_ = 0x10;
      local_2800 = vandps_avx(auVar149,auVar102);
      auVar109._8_4_ = 0x20;
      auVar109._0_8_ = 0x2000000020;
      auVar109._12_4_ = 0x20;
      auVar109._16_4_ = 0x20;
      auVar109._20_4_ = 0x20;
      auVar109._24_4_ = 0x20;
      auVar109._28_4_ = 0x20;
      auVar154._8_4_ = 0x30;
      auVar154._0_8_ = 0x3000000030;
      auVar154._12_4_ = 0x30;
      auVar154._16_4_ = 0x30;
      auVar154._20_4_ = 0x30;
      auVar154._24_4_ = 0x30;
      auVar154._28_4_ = 0x30;
      auVar201 = ZEXT3264(auVar154);
      auVar102 = ZEXT1632(auVar123);
      auVar149 = vcmpps_avx(_local_2840,auVar102,5);
      local_27e0 = vblendvps_avx(auVar154,auVar109,auVar149);
      auVar148._8_4_ = 0x40;
      auVar148._0_8_ = 0x4000000040;
      auVar148._12_4_ = 0x40;
      auVar148._16_4_ = 0x40;
      auVar148._20_4_ = 0x40;
      auVar148._24_4_ = 0x40;
      auVar148._28_4_ = 0x40;
      auVar161._8_4_ = 0x50;
      auVar161._0_8_ = 0x5000000050;
      auVar161._12_4_ = 0x50;
      auVar161._16_4_ = 0x50;
      auVar161._20_4_ = 0x50;
      auVar161._24_4_ = 0x50;
      auVar161._28_4_ = 0x50;
      auVar149 = vcmpps_avx(_local_2820,auVar102,5);
      auVar184 = ZEXT3264(auVar149);
      local_27c0 = vblendvps_avx(auVar161,auVar148,auVar149);
      auVar149 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar102);
      auVar102 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar102);
      local_2720 = vpmovsxwd_avx2(auVar159);
      auVar173 = ZEXT3264(local_2720);
      auVar91._8_4_ = 0x7f800000;
      auVar91._0_8_ = 0x7f8000007f800000;
      auVar91._12_4_ = 0x7f800000;
      auVar91._16_4_ = 0x7f800000;
      auVar91._20_4_ = 0x7f800000;
      auVar91._24_4_ = 0x7f800000;
      auVar91._28_4_ = 0x7f800000;
      local_27a0 = vblendvps_avx(auVar91,auVar149,local_2720);
      auVar149._8_4_ = 0xff800000;
      auVar149._0_8_ = 0xff800000ff800000;
      auVar149._12_4_ = 0xff800000;
      auVar149._16_4_ = 0xff800000;
      auVar149._20_4_ = 0xff800000;
      auVar149._24_4_ = 0xff800000;
      auVar149._28_4_ = 0xff800000;
      local_2780 = vblendvps_avx(auVar149,auVar102,local_2720);
      auVar123 = vpcmpeqd_avx(local_2780._0_16_,local_2780._0_16_);
      local_2bc0 = vpmovsxwd_avx2(auVar159 ^ auVar123);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar79 = 5;
      }
      else {
        uVar79 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2d68 = ray + 0x100;
      puVar80 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar74 = (undefined1 (*) [32])local_1e40;
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar116 = ZEXT3264(local_1e80);
      local_2608 = (local_2c08->root).ptr;
      local_1e60 = local_27a0;
      local_2740 = mm_lookupmask_ps._16_8_;
      uStack_2738 = mm_lookupmask_ps._24_8_;
      uStack_2730 = mm_lookupmask_ps._16_8_;
      uStack_2728 = mm_lookupmask_ps._24_8_;
      pRVar72 = &local_2a40;
      local_2cc8 = pRVar72;
      local_2760 = mm_lookupmask_pd._0_8_;
      uStack_2758 = mm_lookupmask_pd._8_8_;
      uStack_2750 = mm_lookupmask_pd._0_8_;
      uStack_2748 = mm_lookupmask_pd._8_8_;
      do {
        pauVar74 = pauVar74 + -1;
        root.ptr = puVar80[-1];
        puVar80 = puVar80 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_005bc719:
          iVar67 = 3;
        }
        else {
          _local_2de0 = *pauVar74;
          auVar293 = ZEXT3264(_local_2de0);
          auVar149 = vcmpps_avx(_local_2de0,local_2780,1);
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0x7f,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0xbf,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar149[0x1f]) {
LAB_005bc72a:
            iVar67 = 2;
          }
          else {
            uVar70 = vmovmskps_avx(auVar149);
            pRVar72 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar72 >> 0x20),uVar70);
            iVar67 = 0;
            if ((uint)POPCOUNT(uVar70) <= uVar79) {
              while (pRVar72 != (RTCIntersectArguments *)0x0) {
                local_2e00 = (undefined1  [8])pRVar72;
                k = 0;
                for (; ((ulong)pRVar72 & 1) == 0;
                    pRVar72 = (RTCIntersectArguments *)((ulong)pRVar72 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                local_2ca0 = (undefined1  [8])k;
                auVar116 = ZEXT1664(auVar116._0_16_);
                auVar173 = ZEXT1664(auVar173._0_16_);
                auVar184 = ZEXT1664(auVar184._0_16_);
                auVar201 = ZEXT1664(auVar201._0_16_);
                auVar215 = ZEXT1664(auVar215._0_16_);
                auVar229 = ZEXT1664(auVar229._0_16_);
                auVar251 = ZEXT1664(auVar251._0_16_);
                auVar260 = ZEXT1664(auVar260._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                bVar82 = occluded1(local_2cd0,local_2c08,root,k,&local_2e01,ray,
                                   (TravRayK<8,_true> *)&local_2920.field_0,context);
                if (bVar82) {
                  *(undefined4 *)(local_2bc0 + (long)local_2ca0 * 4) = 0xffffffff;
                }
                auVar293 = ZEXT3264(_local_2de0);
                pRVar72 = (RTCIntersectArguments *)((long)local_2e00 - 1U & (ulong)local_2e00);
              }
              auVar149 = _DAT_0205a980 & ~local_2bc0;
              iVar67 = 3;
              pRVar72 = (RTCIntersectArguments *)0x0;
              if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar149 >> 0x7f,0) != '\0') ||
                    (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar149 >> 0xbf,0) != '\0') ||
                  (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar149[0x1f] < '\0') {
                auVar116 = ZEXT3264(local_2780);
                auVar131._8_4_ = 0xff800000;
                auVar131._0_8_ = 0xff800000ff800000;
                auVar131._12_4_ = 0xff800000;
                auVar131._16_4_ = 0xff800000;
                auVar131._20_4_ = 0xff800000;
                auVar131._24_4_ = 0xff800000;
                auVar131._28_4_ = 0xff800000;
                local_2780 = vblendvps_avx(local_2780,auVar131,local_2bc0);
                auVar293 = ZEXT3264(_local_2de0);
                iVar67 = 2;
              }
            }
            if (uVar79 < (uint)POPCOUNT(uVar70)) {
              do {
                uVar81 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  auVar149 = vpcmpeqd_avx2(auVar116._0_32_,auVar116._0_32_);
                  auVar116 = ZEXT3264(auVar149);
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_005bc719;
                  auVar102 = vcmpps_avx(local_2780,auVar293._0_32_,6);
                  if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar102 >> 0x7f,0) != '\0') ||
                        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar102 >> 0xbf,0) != '\0') ||
                      (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar102[0x1f] < '\0') {
                    local_2c00 = (ulong)(uVar81 & 0xf) - 8;
                    auVar96 = local_2bc0;
                    if (local_2c00 != 0) {
                      auVar149 = local_2bc0 ^ auVar149;
                      uVar69 = 0;
                      do {
                        auVar241 = ZEXT3264(auVar149);
                        local_2bf8 = uVar69;
                        uVar66 = vmovmskps_avx(auVar149);
                        uVar68 = CONCAT44((int)(uVar69 >> 0x20),uVar66);
                        uVar81 = 0;
                        for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                          uVar81 = uVar81 + 1;
                        }
                        local_2be8 = (RTCIntersectArguments *)(ulong)uVar81;
                        local_2da8 = 0;
                        for (uVar73 = uVar68; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                          local_2da8 = local_2da8 + 1;
                        }
                        auVar270 = ZEXT3264(auVar149);
                        local_2be0 = auVar149;
                        pRVar72 = (RTCIntersectArguments *)(ulong)uVar81;
                        pRVar71 = (RTCIntersectArguments *)
                                  (uVar69 * 0x60 + (root.ptr & 0xfffffffffffffff0));
                        uVar69 = 0;
                        while( true ) {
                          fVar120 = auVar201._28_4_;
                          fVar83 = auVar184._28_4_;
                          auVar300 = auVar293._28_36_;
                          auVar91 = auVar270._0_32_;
                          auVar102 = auVar241._0_32_;
                          iVar67 = *(int *)((long)&pRVar71[2].filter + uVar69 * 4);
                          if (iVar67 == -1) break;
                          local_2bf0 = (ulong)*(uint *)((long)&pRVar71[2].flags + uVar69 * 4);
                          auVar75 = (undefined1  [8])
                                    (context->scene->geometries).items[local_2bf0].ptr;
                          fVar98 = (((Geometry *)auVar75)->time_range).lower;
                          auVar85._4_4_ = fVar98;
                          auVar85._0_4_ = fVar98;
                          auVar85._8_4_ = fVar98;
                          auVar85._12_4_ = fVar98;
                          auVar85._16_4_ = fVar98;
                          auVar85._20_4_ = fVar98;
                          auVar85._24_4_ = fVar98;
                          auVar85._28_4_ = fVar98;
                          auVar149 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar85);
                          fVar98 = (((Geometry *)auVar75)->time_range).upper - fVar98;
                          auVar86._4_4_ = fVar98;
                          auVar86._0_4_ = fVar98;
                          auVar86._8_4_ = fVar98;
                          auVar86._12_4_ = fVar98;
                          auVar86._16_4_ = fVar98;
                          auVar86._20_4_ = fVar98;
                          auVar86._24_4_ = fVar98;
                          auVar86._28_4_ = fVar98;
                          auVar149 = vdivps_avx(auVar149,auVar86);
                          fVar98 = ((Geometry *)auVar75)->fnumTimeSegments;
                          auVar170._4_4_ = fVar98 * auVar149._4_4_;
                          auVar170._0_4_ = fVar98 * auVar149._0_4_;
                          auVar170._8_4_ = fVar98 * auVar149._8_4_;
                          auVar170._12_4_ = fVar98 * auVar149._12_4_;
                          auVar170._16_4_ = fVar98 * auVar149._16_4_;
                          auVar170._20_4_ = fVar98 * auVar149._20_4_;
                          auVar170._24_4_ = fVar98 * auVar149._24_4_;
                          auVar170._28_4_ = auVar149._28_4_;
                          auVar149 = vroundps_avx(auVar170,1);
                          fVar98 = fVar98 + -1.0;
                          auVar103._4_4_ = fVar98;
                          auVar103._0_4_ = fVar98;
                          auVar103._8_4_ = fVar98;
                          auVar103._12_4_ = fVar98;
                          auVar103._16_4_ = fVar98;
                          auVar103._20_4_ = fVar98;
                          auVar103._24_4_ = fVar98;
                          auVar103._28_4_ = fVar98;
                          auVar149 = vminps_avx(auVar149,auVar103);
                          auVar149 = vmaxps_avx(auVar149,_DAT_02020f00);
                          auVar109 = vsubps_avx(auVar170,auVar149);
                          local_2d60 = vcvtps2dq_avx(auVar149);
                          uVar81 = *(uint *)(local_2d60 + (long)local_2be8 * 4);
                          auVar126._4_4_ = uVar81;
                          auVar126._0_4_ = uVar81;
                          auVar126._8_4_ = uVar81;
                          auVar126._12_4_ = uVar81;
                          auVar126._16_4_ = uVar81;
                          auVar126._20_4_ = uVar81;
                          auVar126._24_4_ = uVar81;
                          auVar126._28_4_ = uVar81;
                          auVar147 = ZEXT436(uVar81);
                          auVar149 = vpcmpeqd_avx2(auVar126,local_2d60);
                          auVar102 = auVar102 & ~auVar149;
                          local_2c40 = auVar91;
                          fVar100 = auVar109._4_4_;
                          fVar97 = auVar109._8_4_;
                          fVar99 = auVar109._12_4_;
                          fVar101 = auVar109._16_4_;
                          fVar84 = auVar109._20_4_;
                          fVar132 = auVar109._24_4_;
                          fVar98 = auVar109._0_4_;
                          auVar184._28_36_ = auVar260._28_36_;
                          auVar201._28_36_ = auVar270._28_36_;
                          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar102 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar102 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar102 >> 0x7f,0) == '\0') &&
                                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar102 >> 0xbf,0) == '\0') &&
                              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar102[0x1f]) {
                            lVar3 = *(long *)(*(long *)&((Geometry *)((long)auVar75 + 0xc0))->
                                                        numPrimitives + (long)(int)uVar81 * 0x38);
                            lVar4 = *(long *)(*(long *)&((Geometry *)((long)auVar75 + 0xc0))->
                                                        numPrimitives + 0x38 +
                                             (long)(int)uVar81 * 0x38);
                            uVar73 = (ulong)*(uint *)((long)&pRVar71->flags + uVar69 * 4);
                            uVar70 = *(undefined4 *)(lVar3 + uVar73 * 4);
                            auVar180._4_4_ = uVar70;
                            auVar180._0_4_ = uVar70;
                            auVar180._8_4_ = uVar70;
                            auVar180._12_4_ = uVar70;
                            auVar180._16_4_ = uVar70;
                            auVar180._20_4_ = uVar70;
                            auVar180._24_4_ = uVar70;
                            auVar180._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 4 + uVar73 * 4);
                            auVar196._4_4_ = uVar70;
                            auVar196._0_4_ = uVar70;
                            auVar196._8_4_ = uVar70;
                            auVar196._12_4_ = uVar70;
                            auVar196._16_4_ = uVar70;
                            auVar196._20_4_ = uVar70;
                            auVar196._24_4_ = uVar70;
                            auVar196._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 8 + uVar73 * 4);
                            auVar211._4_4_ = uVar70;
                            auVar211._0_4_ = uVar70;
                            auVar211._8_4_ = uVar70;
                            auVar211._12_4_ = uVar70;
                            auVar211._16_4_ = uVar70;
                            auVar211._20_4_ = uVar70;
                            auVar211._24_4_ = uVar70;
                            auVar211._28_4_ = uVar70;
                            fVar83 = *(float *)(lVar4 + uVar73 * 4);
                            fVar120 = *(float *)(lVar4 + 4 + uVar73 * 4);
                            fVar135 = *(float *)(lVar4 + 8 + uVar73 * 4);
                            uVar73 = (ulong)*(uint *)((long)&pRVar71->filter + uVar69 * 4);
                            auVar104._8_4_ = 0x3f800000;
                            auVar104._0_8_ = &DAT_3f8000003f800000;
                            auVar104._12_4_ = 0x3f800000;
                            auVar104._16_4_ = 0x3f800000;
                            auVar104._20_4_ = 0x3f800000;
                            auVar104._24_4_ = 0x3f800000;
                            auVar104._28_4_ = 0x3f800000;
                            auVar149 = vsubps_avx(auVar104,auVar109);
                            auVar184._0_4_ = fVar98 * fVar83;
                            auVar184._4_4_ = fVar100 * fVar83;
                            auVar184._8_4_ = fVar97 * fVar83;
                            auVar184._12_4_ = fVar99 * fVar83;
                            auVar184._16_4_ = fVar101 * fVar83;
                            auVar184._20_4_ = fVar84 * fVar83;
                            auVar184._24_4_ = fVar132 * fVar83;
                            auVar12._4_4_ = fVar100 * fVar120;
                            auVar12._0_4_ = fVar98 * fVar120;
                            auVar12._8_4_ = fVar97 * fVar120;
                            auVar12._12_4_ = fVar99 * fVar120;
                            auVar12._16_4_ = fVar101 * fVar120;
                            auVar12._20_4_ = fVar84 * fVar120;
                            auVar12._24_4_ = fVar132 * fVar120;
                            auVar12._28_4_ = fVar120;
                            auVar13._4_4_ = fVar100 * fVar135;
                            auVar13._0_4_ = fVar98 * fVar135;
                            auVar13._8_4_ = fVar97 * fVar135;
                            auVar13._12_4_ = fVar99 * fVar135;
                            auVar13._16_4_ = fVar101 * fVar135;
                            auVar13._20_4_ = fVar84 * fVar135;
                            auVar13._24_4_ = fVar132 * fVar135;
                            auVar13._28_4_ = fVar135;
                            auVar123 = vfmadd231ps_fma(auVar184._0_32_,auVar149,auVar180);
                            auVar184 = ZEXT1664(auVar123);
                            auVar123 = vfmadd231ps_fma(auVar12,auVar149,auVar196);
                            auVar158 = ZEXT1632(auVar123);
                            auVar123 = vfmadd231ps_fma(auVar13,auVar149,auVar211);
                            auVar172 = ZEXT1632(auVar123);
                            uVar70 = *(undefined4 *)(lVar3 + uVar73 * 4);
                            auVar181._4_4_ = uVar70;
                            auVar181._0_4_ = uVar70;
                            auVar181._8_4_ = uVar70;
                            auVar181._12_4_ = uVar70;
                            auVar181._16_4_ = uVar70;
                            auVar181._20_4_ = uVar70;
                            auVar181._24_4_ = uVar70;
                            auVar181._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 4 + uVar73 * 4);
                            auVar197._4_4_ = uVar70;
                            auVar197._0_4_ = uVar70;
                            auVar197._8_4_ = uVar70;
                            auVar197._12_4_ = uVar70;
                            auVar197._16_4_ = uVar70;
                            auVar197._20_4_ = uVar70;
                            auVar197._24_4_ = uVar70;
                            auVar197._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 8 + uVar73 * 4);
                            auVar212._4_4_ = uVar70;
                            auVar212._0_4_ = uVar70;
                            auVar212._8_4_ = uVar70;
                            auVar212._12_4_ = uVar70;
                            auVar212._16_4_ = uVar70;
                            auVar212._20_4_ = uVar70;
                            auVar212._24_4_ = uVar70;
                            auVar212._28_4_ = uVar70;
                            fVar120 = *(float *)(lVar4 + uVar73 * 4);
                            fVar135 = *(float *)(lVar4 + 4 + uVar73 * 4);
                            fVar138 = *(float *)(lVar4 + 8 + uVar73 * 4);
                            auVar14._4_4_ = fVar120 * fVar100;
                            auVar14._0_4_ = fVar120 * fVar98;
                            auVar14._8_4_ = fVar120 * fVar97;
                            auVar14._12_4_ = fVar120 * fVar99;
                            auVar14._16_4_ = fVar120 * fVar101;
                            auVar14._20_4_ = fVar120 * fVar84;
                            auVar14._24_4_ = fVar120 * fVar132;
                            auVar14._28_4_ = fVar83;
                            auVar15._4_4_ = fVar135 * fVar100;
                            auVar15._0_4_ = fVar135 * fVar98;
                            auVar15._8_4_ = fVar135 * fVar97;
                            auVar15._12_4_ = fVar135 * fVar99;
                            auVar15._16_4_ = fVar135 * fVar101;
                            auVar15._20_4_ = fVar135 * fVar84;
                            auVar15._24_4_ = fVar135 * fVar132;
                            auVar15._28_4_ = fVar120;
                            auVar201._0_4_ = fVar138 * fVar98;
                            auVar201._4_4_ = fVar138 * fVar100;
                            auVar201._8_4_ = fVar138 * fVar97;
                            auVar201._12_4_ = fVar138 * fVar99;
                            auVar201._16_4_ = fVar138 * fVar101;
                            auVar201._20_4_ = fVar138 * fVar84;
                            auVar201._24_4_ = fVar138 * fVar132;
                            auVar123 = vfmadd231ps_fma(auVar14,auVar149,auVar181);
                            _local_2ca0 = ZEXT1632(auVar123);
                            auVar123 = vfmadd231ps_fma(auVar15,auVar149,auVar197);
                            _local_2e00 = ZEXT1632(auVar123);
                            uVar73 = (ulong)*(uint *)((long)&pRVar71[1].flags + uVar69 * 4);
                            uVar70 = *(undefined4 *)(lVar3 + uVar73 * 4);
                            auVar182._4_4_ = uVar70;
                            auVar182._0_4_ = uVar70;
                            auVar182._8_4_ = uVar70;
                            auVar182._12_4_ = uVar70;
                            auVar182._16_4_ = uVar70;
                            auVar182._20_4_ = uVar70;
                            auVar182._24_4_ = uVar70;
                            auVar182._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 4 + uVar73 * 4);
                            auVar198._4_4_ = uVar70;
                            auVar198._0_4_ = uVar70;
                            auVar198._8_4_ = uVar70;
                            auVar198._12_4_ = uVar70;
                            auVar198._16_4_ = uVar70;
                            auVar198._20_4_ = uVar70;
                            auVar198._24_4_ = uVar70;
                            auVar198._28_4_ = uVar70;
                            uVar70 = *(undefined4 *)(lVar3 + 8 + uVar73 * 4);
                            auVar224._4_4_ = uVar70;
                            auVar224._0_4_ = uVar70;
                            auVar224._8_4_ = uVar70;
                            auVar224._12_4_ = uVar70;
                            auVar224._16_4_ = uVar70;
                            auVar224._20_4_ = uVar70;
                            auVar224._24_4_ = uVar70;
                            auVar224._28_4_ = uVar70;
                            fVar83 = *(float *)(lVar4 + uVar73 * 4);
                            fVar120 = *(float *)(lVar4 + 4 + uVar73 * 4);
                            auVar123 = vfmadd231ps_fma(auVar201._0_32_,auVar149,auVar212);
                            _local_2de0 = ZEXT1632(auVar123);
                            fVar135 = *(float *)(lVar4 + 8 + uVar73 * 4);
                            auVar16._4_4_ = fVar83 * fVar100;
                            auVar16._0_4_ = fVar83 * fVar98;
                            auVar16._8_4_ = fVar83 * fVar97;
                            auVar16._12_4_ = fVar83 * fVar99;
                            auVar16._16_4_ = fVar83 * fVar101;
                            auVar16._20_4_ = fVar83 * fVar84;
                            auVar16._24_4_ = fVar83 * fVar132;
                            auVar16._28_4_ = fVar83;
                            auVar17._4_4_ = fVar120 * fVar100;
                            auVar17._0_4_ = fVar120 * fVar98;
                            auVar17._8_4_ = fVar120 * fVar97;
                            auVar17._12_4_ = fVar120 * fVar99;
                            auVar17._16_4_ = fVar120 * fVar101;
                            auVar17._20_4_ = fVar120 * fVar84;
                            auVar17._24_4_ = fVar120 * fVar132;
                            auVar17._28_4_ = fVar120;
                            auVar18._4_4_ = fVar100 * fVar135;
                            auVar18._0_4_ = fVar98 * fVar135;
                            auVar18._8_4_ = fVar97 * fVar135;
                            auVar18._12_4_ = fVar99 * fVar135;
                            auVar18._16_4_ = fVar101 * fVar135;
                            auVar18._20_4_ = fVar84 * fVar135;
                            auVar18._24_4_ = fVar132 * fVar135;
                            auVar18._28_4_ = fVar135;
                            auVar123 = vfmadd231ps_fma(auVar16,auVar149,auVar182);
                            _local_2b40 = ZEXT1632(auVar123);
                            auVar123 = vfmadd231ps_fma(auVar17,auVar149,auVar198);
                            _local_2b60 = ZEXT1632(auVar123);
                            auVar123 = vfmadd231ps_fma(auVar18,auVar149,auVar224);
                            _local_2b80 = ZEXT1632(auVar123);
                            uVar73 = (ulong)*(uint *)((long)&pRVar71[1].filter + uVar69 * 4);
                            uVar70 = *(undefined4 *)(lVar3 + uVar73 * 4);
                            auVar183._4_4_ = uVar70;
                            auVar183._0_4_ = uVar70;
                            auVar183._8_4_ = uVar70;
                            auVar183._12_4_ = uVar70;
                            auVar183._16_4_ = uVar70;
                            auVar183._20_4_ = uVar70;
                            auVar183._24_4_ = uVar70;
                            auVar183._28_4_ = uVar70;
                            fVar83 = *(float *)(lVar4 + uVar73 * 4);
                            fVar120 = *(float *)(lVar4 + 4 + uVar73 * 4);
                            fVar135 = *(float *)(lVar4 + 8 + uVar73 * 4);
                            auVar239._0_4_ = fVar98 * fVar83;
                            auVar239._4_4_ = fVar100 * fVar83;
                            auVar239._8_4_ = fVar97 * fVar83;
                            auVar239._12_4_ = fVar99 * fVar83;
                            auVar239._16_4_ = fVar101 * fVar83;
                            auVar239._20_4_ = fVar84 * fVar83;
                            auVar239._24_4_ = fVar132 * fVar83;
                            auVar239._28_4_ = 0;
                            auVar249._0_4_ = fVar98 * fVar120;
                            auVar249._4_4_ = fVar100 * fVar120;
                            auVar249._8_4_ = fVar97 * fVar120;
                            auVar249._12_4_ = fVar99 * fVar120;
                            auVar249._16_4_ = fVar101 * fVar120;
                            auVar249._20_4_ = fVar84 * fVar120;
                            auVar249._24_4_ = fVar132 * fVar120;
                            auVar249._28_4_ = 0;
                            auVar19._4_4_ = fVar135 * fVar100;
                            auVar19._0_4_ = fVar135 * fVar98;
                            auVar19._8_4_ = fVar135 * fVar97;
                            auVar19._12_4_ = fVar135 * fVar99;
                            auVar19._16_4_ = fVar135 * fVar101;
                            auVar19._20_4_ = fVar135 * fVar84;
                            auVar19._24_4_ = fVar135 * fVar132;
                            auVar19._28_4_ = fVar120;
                            auVar123 = vfmadd231ps_fma(auVar239,auVar149,auVar183);
                            local_2640 = ZEXT1632(auVar123);
                            uVar70 = *(undefined4 *)(lVar3 + 4 + uVar73 * 4);
                            auVar87._4_4_ = uVar70;
                            auVar87._0_4_ = uVar70;
                            auVar87._8_4_ = uVar70;
                            auVar87._12_4_ = uVar70;
                            auVar87._16_4_ = uVar70;
                            auVar87._20_4_ = uVar70;
                            auVar87._24_4_ = uVar70;
                            auVar87._28_4_ = uVar70;
                            auVar123 = vfmadd231ps_fma(auVar249,auVar149,auVar87);
                            local_2660 = ZEXT1632(auVar123);
                            uVar70 = *(undefined4 *)(lVar3 + 8 + uVar73 * 4);
                            auVar88._4_4_ = uVar70;
                            auVar88._0_4_ = uVar70;
                            auVar88._8_4_ = uVar70;
                            auVar88._12_4_ = uVar70;
                            auVar88._16_4_ = uVar70;
                            auVar88._20_4_ = uVar70;
                            auVar88._24_4_ = uVar70;
                            auVar88._28_4_ = uVar70;
                            auVar123 = vfmadd231ps_fma(auVar19,auVar149,auVar88);
                            local_2680 = ZEXT1632(auVar123);
                          }
                          else {
                            if (uVar68 != 0) {
                              lVar3 = *(long *)&((Geometry *)((long)auVar75 + 0xc0))->numPrimitives;
                              uVar76 = (ulong)*(uint *)((long)&pRVar71->flags + uVar69 * 4);
                              uVar73 = local_2da8;
                              uVar77 = uVar68;
                              do {
                                auVar123 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + (long)*(int *)(local_2d60 +
                                                                             uVar73 * 4) * 0x38) +
                                            uVar76 * 4);
                                auVar159 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + 0x38 +
                                                      (long)*(int *)(local_2d60 + uVar73 * 4) * 0x38
                                                      ) + uVar76 * 4);
                                auVar147 = (undefined1  [36])0x0;
                                *(int *)(local_2b20 + uVar73 * 4) = auVar123._0_4_;
                                uVar70 = vextractps_avx(auVar123,1);
                                *(undefined4 *)(local_2b00 + uVar73 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar123,2);
                                *(undefined4 *)(local_2ae0 + uVar73 * 4) = uVar70;
                                *(int *)(local_2d40 + uVar73 * 4) = auVar159._0_4_;
                                *(int *)((long)&local_2d20 + uVar73 * 4) = auVar159._4_4_;
                                local_2d00[uVar73] = auVar159._8_4_;
                                uVar77 = uVar77 ^ 1L << (uVar73 & 0x3f);
                                uVar73 = 0;
                                for (uVar7 = uVar77; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  uVar73 = uVar73 + 1;
                                }
                              } while (uVar77 != 0);
                            }
                            auVar112._8_4_ = 0x3f800000;
                            auVar112._0_8_ = &DAT_3f8000003f800000;
                            auVar112._12_4_ = 0x3f800000;
                            auVar112._16_4_ = 0x3f800000;
                            auVar112._20_4_ = 0x3f800000;
                            auVar112._24_4_ = 0x3f800000;
                            auVar112._28_4_ = 0x3f800000;
                            auVar149 = vsubps_avx(auVar112,auVar109);
                            fVar138 = auVar149._0_4_;
                            fVar258 = fVar138 * (float)local_2b20._0_4_;
                            fVar141 = auVar149._4_4_;
                            fVar261 = fVar141 * (float)local_2b20._4_4_;
                            fVar143 = auVar149._8_4_;
                            fVar262 = fVar143 * fStack_2b18;
                            fVar145 = auVar149._12_4_;
                            fVar263 = fVar145 * fStack_2b14;
                            fVar117 = auVar149._16_4_;
                            fVar264 = fVar117 * fStack_2b10;
                            fVar118 = auVar149._20_4_;
                            fVar265 = fVar118 * fStack_2b0c;
                            fVar119 = auVar149._24_4_;
                            fVar266 = fVar119 * fStack_2b08;
                            auVar116._0_4_ = fVar138 * (float)local_2b00._0_4_;
                            auVar116._4_4_ = fVar141 * (float)local_2b00._4_4_;
                            auVar116._8_4_ = fVar143 * fStack_2af8;
                            auVar116._12_4_ = fVar145 * fStack_2af4;
                            auVar116._16_4_ = fVar117 * fStack_2af0;
                            auVar116._20_4_ = fVar118 * fStack_2aec;
                            auVar116._24_4_ = fVar119 * fStack_2ae8;
                            auVar116._28_36_ = auVar147;
                            _local_2ca0 = auVar116._0_32_;
                            fVar135 = auVar147._0_4_;
                            local_2c60._4_4_ = fVar141 * (float)local_2ae0._4_4_;
                            local_2c60._0_4_ = fVar138 * (float)local_2ae0._0_4_;
                            fStack_2c58 = fVar143 * fStack_2ad8;
                            fStack_2c54 = fVar145 * fStack_2ad4;
                            fStack_2c50 = fVar117 * fStack_2ad0;
                            fStack_2c4c = fVar118 * fStack_2acc;
                            fStack_2c48 = fVar119 * fStack_2ac8;
                            fStack_2c44 = fVar135;
                            fVar122 = fVar98 * (float)local_2d40._0_4_;
                            fVar134 = fVar100 * (float)local_2d40._4_4_;
                            fVar137 = fVar97 * (float)uStack_2d38;
                            fVar140 = fVar99 * uStack_2d38._4_4_;
                            fVar121 = fVar101 * (float)uStack_2d30;
                            fVar133 = fVar84 * uStack_2d30._4_4_;
                            fVar136 = fVar132 * pRStack_2d28._0_4_;
                            local_2cc0._4_4_ = fVar100 * local_2d20._4_4_;
                            local_2cc0._0_4_ = fVar98 * (float)local_2d20;
                            fStack_2cb8 = fVar97 * fStack_2d18;
                            fStack_2cb4 = fVar99 * fStack_2d14;
                            fStack_2cb0 = fVar101 * fStack_2d10;
                            fStack_2cac = fVar84 * fStack_2d0c;
                            fStack_2ca8 = fVar132 * fStack_2d08;
                            fStack_2ca4 = fVar135;
                            fVar139 = fVar98 * local_2d00[0];
                            fVar142 = fVar100 * local_2d00[1];
                            fVar144 = fVar97 * local_2d00[2];
                            fVar146 = fVar99 * local_2d00[3];
                            fVar174 = fVar101 * fStack_2cf0;
                            fVar175 = fVar84 * fStack_2cec;
                            fVar176 = fVar132 * fStack_2ce8;
                            if (uVar68 != 0) {
                              lVar3 = *(long *)&((Geometry *)((long)auVar75 + 0xc0))->numPrimitives;
                              uVar76 = (ulong)*(uint *)((long)&pRVar71->filter + uVar69 * 4);
                              uVar73 = local_2da8;
                              uVar77 = uVar68;
                              do {
                                auVar123 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + (long)*(int *)(local_2d60 +
                                                                             uVar73 * 4) * 0x38) +
                                            uVar76 * 4);
                                fVar83 = 0.0;
                                auVar159 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + 0x38 +
                                                      (long)*(int *)(local_2d60 + uVar73 * 4) * 0x38
                                                      ) + uVar76 * 4);
                                fVar120 = 0.0;
                                *(int *)(local_2b20 + uVar73 * 4) = auVar123._0_4_;
                                uVar70 = vextractps_avx(auVar123,1);
                                *(undefined4 *)(local_2b00 + uVar73 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar123,2);
                                *(undefined4 *)(local_2ae0 + uVar73 * 4) = uVar70;
                                *(int *)(local_2d40 + uVar73 * 4) = auVar159._0_4_;
                                uVar70 = vextractps_avx(auVar159,1);
                                *(undefined4 *)((long)&local_2d20 + uVar73 * 4) = uVar70;
                                fVar236 = (float)vextractps_avx(auVar159,2);
                                local_2d00[uVar73] = fVar236;
                                uVar77 = uVar77 ^ 1L << (uVar73 & 0x3f);
                                uVar73 = 0;
                                for (uVar7 = uVar77; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  uVar73 = uVar73 + 1;
                                }
                              } while (uVar77 != 0);
                            }
                            local_2c80._4_4_ = fVar141 * (float)local_2b20._4_4_;
                            local_2c80._0_4_ = fVar138 * (float)local_2b20._0_4_;
                            auStack_2c78._0_4_ = fVar143 * fStack_2b18;
                            auStack_2c78._4_4_ = fVar145 * fStack_2b14;
                            fStack_2c70 = fVar117 * fStack_2b10;
                            fStack_2c6c = fVar118 * fStack_2b0c;
                            fStack_2c68 = fVar119 * fStack_2b08;
                            fStack_2c64 = fVar135;
                            local_2ba0._4_4_ = fVar141 * (float)local_2b00._4_4_;
                            local_2ba0._0_4_ = fVar138 * (float)local_2b00._0_4_;
                            fStack_2b98 = fVar143 * fStack_2af8;
                            fStack_2b94 = fVar145 * fStack_2af4;
                            fStack_2b90 = fVar117 * fStack_2af0;
                            fStack_2b8c = fVar118 * fStack_2aec;
                            fStack_2b88 = fVar119 * fStack_2ae8;
                            fStack_2b84 = fVar135;
                            fVar248 = fVar138 * (float)local_2ae0._0_4_;
                            fVar252 = fVar141 * (float)local_2ae0._4_4_;
                            fVar253 = fVar143 * fStack_2ad8;
                            fVar254 = fVar145 * fStack_2ad4;
                            fVar255 = fVar117 * fStack_2ad0;
                            fVar256 = fVar118 * fStack_2acc;
                            fVar257 = fVar119 * fStack_2ac8;
                            fVar236 = fVar98 * (float)local_2d40._0_4_;
                            fVar242 = fVar100 * (float)local_2d40._4_4_;
                            fVar243 = fVar97 * (float)uStack_2d38;
                            fVar244 = fVar99 * uStack_2d38._4_4_;
                            fVar245 = fVar101 * (float)uStack_2d30;
                            fVar246 = fVar84 * uStack_2d30._4_4_;
                            fVar247 = fVar132 * pRStack_2d28._0_4_;
                            fVar267 = fVar98 * (float)local_2d20;
                            fVar271 = fVar100 * local_2d20._4_4_;
                            fVar272 = fVar97 * fStack_2d18;
                            fVar273 = fVar99 * fStack_2d14;
                            fVar274 = fVar101 * fStack_2d10;
                            fVar275 = fVar84 * fStack_2d0c;
                            fVar276 = fVar132 * fStack_2d08;
                            fVar277 = fVar98 * local_2d00[0];
                            fVar278 = fVar100 * local_2d00[1];
                            fVar279 = fVar97 * local_2d00[2];
                            fVar280 = fVar99 * local_2d00[3];
                            fVar281 = fVar101 * fStack_2cf0;
                            fVar282 = fVar84 * fStack_2cec;
                            fVar283 = fVar132 * fStack_2ce8;
                            if (uVar68 != 0) {
                              lVar3 = *(long *)&((Geometry *)((long)auVar75 + 0xc0))->numPrimitives;
                              uVar76 = (ulong)*(uint *)((long)&pRVar71[1].flags + uVar69 * 4);
                              uVar73 = local_2da8;
                              uVar77 = uVar68;
                              do {
                                auVar123 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + (long)*(int *)(local_2d60 +
                                                                             uVar73 * 4) * 0x38) +
                                            uVar76 * 4);
                                fVar83 = 0.0;
                                auVar159 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + 0x38 +
                                                      (long)*(int *)(local_2d60 + uVar73 * 4) * 0x38
                                                      ) + uVar76 * 4);
                                fVar120 = 0.0;
                                *(int *)(local_2b20 + uVar73 * 4) = auVar123._0_4_;
                                uVar70 = vextractps_avx(auVar123,1);
                                *(undefined4 *)(local_2b00 + uVar73 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar123,2);
                                *(undefined4 *)(local_2ae0 + uVar73 * 4) = uVar70;
                                *(int *)(local_2d40 + uVar73 * 4) = auVar159._0_4_;
                                uVar70 = vextractps_avx(auVar159,1);
                                *(undefined4 *)((long)&local_2d20 + uVar73 * 4) = uVar70;
                                fVar177 = (float)vextractps_avx(auVar159,2);
                                local_2d00[uVar73] = fVar177;
                                uVar77 = uVar77 ^ 1L << (uVar73 & 0x3f);
                                uVar73 = 0;
                                for (uVar7 = uVar77; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  uVar73 = uVar73 + 1;
                                }
                              } while (uVar77 != 0);
                            }
                            fVar177 = fVar138 * (float)local_2b20._0_4_;
                            fVar185 = fVar141 * (float)local_2b20._4_4_;
                            fVar186 = fVar143 * fStack_2b18;
                            fVar187 = fVar145 * fStack_2b14;
                            fVar188 = fVar117 * fStack_2b10;
                            fVar189 = fVar118 * fStack_2b0c;
                            fVar190 = fVar119 * fStack_2b08;
                            fVar191 = fVar138 * (float)local_2b00._0_4_;
                            fVar202 = fVar141 * (float)local_2b00._4_4_;
                            fVar203 = fVar143 * fStack_2af8;
                            fVar204 = fVar145 * fStack_2af4;
                            fVar205 = fVar117 * fStack_2af0;
                            fVar206 = fVar118 * fStack_2aec;
                            fVar207 = fVar119 * fStack_2ae8;
                            fVar284 = fVar138 * (float)local_2ae0._0_4_;
                            fVar286 = fVar141 * (float)local_2ae0._4_4_;
                            fVar287 = fVar143 * fStack_2ad8;
                            fVar288 = fVar145 * fStack_2ad4;
                            fVar289 = fVar117 * fStack_2ad0;
                            fVar290 = fVar118 * fStack_2acc;
                            fVar291 = fVar119 * fStack_2ac8;
                            fVar208 = fVar98 * (float)local_2d40._0_4_;
                            fVar216 = fVar100 * (float)local_2d40._4_4_;
                            fVar217 = fVar97 * (float)uStack_2d38;
                            fVar218 = fVar99 * uStack_2d38._4_4_;
                            fVar219 = fVar101 * (float)uStack_2d30;
                            fVar220 = fVar84 * uStack_2d30._4_4_;
                            fVar221 = fVar132 * pRStack_2d28._0_4_;
                            fVar222 = fVar98 * (float)local_2d20;
                            fVar230 = fVar100 * local_2d20._4_4_;
                            fVar231 = fVar97 * fStack_2d18;
                            fVar232 = fVar99 * fStack_2d14;
                            fVar233 = fVar101 * fStack_2d10;
                            fVar234 = fVar84 * fStack_2d0c;
                            fVar235 = fVar132 * fStack_2d08;
                            fVar292 = fVar98 * local_2d00[0];
                            fVar294 = fVar100 * local_2d00[1];
                            fVar295 = fVar97 * local_2d00[2];
                            fVar296 = fVar99 * local_2d00[3];
                            fVar297 = fVar101 * fStack_2cf0;
                            fVar298 = fVar84 * fStack_2cec;
                            fVar299 = fVar132 * fStack_2ce8;
                            auVar300 = ZEXT436((uint)auVar293._28_4_);
                            if (uVar68 != 0) {
                              lVar3 = *(long *)&((Geometry *)((long)auVar75 + 0xc0))->numPrimitives;
                              uVar76 = (ulong)*(uint *)((long)&pRVar71[1].filter + uVar69 * 4);
                              uVar73 = local_2da8;
                              uVar77 = uVar68;
                              do {
                                auVar123 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + (long)*(int *)(local_2d60 +
                                                                             uVar73 * 4) * 0x38) +
                                            uVar76 * 4);
                                auVar159 = *(undefined1 (*) [16])
                                            (*(long *)(lVar3 + 0x38 +
                                                      (long)*(int *)(local_2d60 + uVar73 * 4) * 0x38
                                                      ) + uVar76 * 4);
                                *(int *)(local_2b20 + uVar73 * 4) = auVar123._0_4_;
                                uVar70 = vextractps_avx(auVar123,1);
                                *(undefined4 *)(local_2b00 + uVar73 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar123,2);
                                *(undefined4 *)(local_2ae0 + uVar73 * 4) = uVar70;
                                *(int *)(local_2d40 + uVar73 * 4) = auVar159._0_4_;
                                uVar70 = vextractps_avx(auVar159,1);
                                *(undefined4 *)((long)&local_2d20 + uVar73 * 4) = uVar70;
                                fVar2 = (float)vextractps_avx(auVar159,2);
                                local_2d00[uVar73] = fVar2;
                                uVar77 = uVar77 ^ 1L << (uVar73 & 0x3f);
                                uVar73 = 0;
                                for (uVar7 = uVar77; (uVar7 & 1) == 0;
                                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                                  uVar73 = uVar73 + 1;
                                }
                              } while (uVar77 != 0);
                            }
                            auVar184 = ZEXT3264(CONCAT428(auVar260._28_4_ + fVar135,
                                                          CONCAT424(fVar266 + fVar136,
                                                                    CONCAT420(fVar265 + fVar133,
                                                                              CONCAT416(fVar264 + 
                                                  fVar121,CONCAT412(fVar263 + fVar140,
                                                                    CONCAT48(fVar262 + fVar137,
                                                                             CONCAT44(fVar261 + 
                                                  fVar134,fVar258 + fVar122))))))));
                            auVar158._0_4_ = (float)local_2cc0._0_4_ + (float)local_2ca0._0_4_;
                            auVar158._4_4_ = (float)local_2cc0._4_4_ + (float)local_2ca0._4_4_;
                            auVar158._8_4_ = fStack_2cb8 + (float)auStack_2c98._0_4_;
                            auVar158._12_4_ = fStack_2cb4 + (float)auStack_2c98._4_4_;
                            auVar158._16_4_ = fStack_2cb0 + fStack_2c90;
                            auVar158._20_4_ = fStack_2cac + fStack_2c8c;
                            auVar158._24_4_ = fStack_2ca8 + fStack_2c88;
                            auVar158._28_4_ = fStack_2ca4 + fStack_2c84;
                            auVar172._0_4_ = fVar139 + (float)local_2c60._0_4_;
                            auVar172._4_4_ = fVar142 + (float)local_2c60._4_4_;
                            auVar172._8_4_ = fVar144 + fStack_2c58;
                            auVar172._12_4_ = fVar146 + fStack_2c54;
                            auVar172._16_4_ = fVar174 + fStack_2c50;
                            auVar172._20_4_ = fVar175 + fStack_2c4c;
                            auVar172._24_4_ = fVar176 + fStack_2c48;
                            auVar172._28_4_ = auVar173._28_4_ + fStack_2c44;
                            local_2ca0._4_4_ = fVar242 + (float)local_2c80._4_4_;
                            local_2ca0._0_4_ = fVar236 + (float)local_2c80._0_4_;
                            auStack_2c98._0_4_ = fVar243 + (float)auStack_2c78._0_4_;
                            auStack_2c98._4_4_ = fVar244 + (float)auStack_2c78._4_4_;
                            fStack_2c90 = fVar245 + fStack_2c70;
                            fStack_2c8c = fVar246 + fStack_2c6c;
                            fStack_2c88 = fVar247 + fStack_2c68;
                            fStack_2c84 = auVar241._28_4_ + fStack_2c64;
                            local_2e00._4_4_ = fVar271 + (float)local_2ba0._4_4_;
                            local_2e00._0_4_ = fVar267 + (float)local_2ba0._0_4_;
                            auStack_2df8._0_4_ = fVar272 + fStack_2b98;
                            auStack_2df8._4_4_ = fVar273 + fStack_2b94;
                            fStack_2df0 = fVar274 + fStack_2b90;
                            fStack_2dec = fVar275 + fStack_2b8c;
                            fStack_2de8 = fVar276 + fStack_2b88;
                            fStack_2de4 = auVar270._28_4_ + fStack_2b84;
                            local_2de0._4_4_ = fVar252 + fVar278;
                            local_2de0._0_4_ = fVar248 + fVar277;
                            auStack_2dd8._0_4_ = fVar253 + fVar279;
                            auStack_2dd8._4_4_ = fVar254 + fVar280;
                            fStack_2dd0 = fVar255 + fVar281;
                            fStack_2dcc = fVar256 + fVar282;
                            fStack_2dc8 = fVar257 + fVar283;
                            fStack_2dc4 = auVar251._28_4_ + in_ZMM13._28_4_;
                            local_2b40._4_4_ = fVar185 + fVar216;
                            local_2b40._0_4_ = fVar177 + fVar208;
                            fStack_2b38 = fVar186 + fVar217;
                            fStack_2b34 = fVar187 + fVar218;
                            fStack_2b30 = fVar188 + fVar219;
                            fStack_2b2c = fVar189 + fVar220;
                            fStack_2b28 = fVar190 + fVar221;
                            fStack_2b24 = fVar83 + auVar215._28_4_;
                            fStack_2b44 = auVar229._28_4_ + fVar120;
                            local_2b60._4_4_ = fVar230 + fVar202;
                            local_2b60._0_4_ = fVar222 + fVar191;
                            fStack_2b58 = fVar231 + fVar203;
                            fStack_2b54 = fVar232 + fVar204;
                            fStack_2b50 = fVar233 + fVar205;
                            fStack_2b4c = fVar234 + fVar206;
                            fStack_2b48 = fVar235 + fVar207;
                            local_2b80._4_4_ = fVar286 + fVar294;
                            local_2b80._0_4_ = fVar284 + fVar292;
                            fStack_2b78 = fVar287 + fVar295;
                            fStack_2b74 = fVar288 + fVar296;
                            fStack_2b70 = fVar289 + fVar297;
                            fStack_2b6c = fVar290 + fVar298;
                            fStack_2b68 = fVar291 + fVar299;
                            fStack_2b64 = in_ZMM14._28_4_ + auVar293._28_4_;
                            local_2640._0_4_ =
                                 fVar138 * (float)local_2b20._0_4_ +
                                 fVar98 * (float)local_2d40._0_4_;
                            local_2640._4_4_ =
                                 fVar141 * (float)local_2b20._4_4_ +
                                 fVar100 * (float)local_2d40._4_4_;
                            local_2640._8_4_ = fVar143 * fStack_2b18 + fVar97 * (float)uStack_2d38;
                            local_2640._12_4_ = fVar145 * fStack_2b14 + fVar99 * uStack_2d38._4_4_;
                            local_2640._16_4_ = fVar117 * fStack_2b10 + fVar101 * (float)uStack_2d30
                            ;
                            local_2640._20_4_ = fVar118 * fStack_2b0c + fVar84 * uStack_2d30._4_4_;
                            local_2640._24_4_ = fVar119 * fStack_2b08 + fVar132 * pRStack_2d28._0_4_
                            ;
                            local_2640._28_4_ = fStack_2b44 + auVar215._28_4_;
                            local_2660._0_4_ =
                                 fVar138 * (float)local_2b00._0_4_ + fVar98 * (float)local_2d20;
                            local_2660._4_4_ =
                                 fVar141 * (float)local_2b00._4_4_ + fVar100 * local_2d20._4_4_;
                            local_2660._8_4_ = fVar143 * fStack_2af8 + fVar97 * fStack_2d18;
                            local_2660._12_4_ = fVar145 * fStack_2af4 + fVar99 * fStack_2d14;
                            local_2660._16_4_ = fVar117 * fStack_2af0 + fVar101 * fStack_2d10;
                            local_2660._20_4_ = fVar118 * fStack_2aec + fVar84 * fStack_2d0c;
                            local_2660._24_4_ = fVar119 * fStack_2ae8 + fVar132 * fStack_2d08;
                            local_2660._28_4_ = fVar120 + fStack_2b44;
                            local_2680._0_4_ =
                                 fVar138 * (float)local_2ae0._0_4_ + fVar98 * local_2d00[0];
                            local_2680._4_4_ =
                                 fVar141 * (float)local_2ae0._4_4_ + fVar100 * local_2d00[1];
                            local_2680._8_4_ = fVar143 * fStack_2ad8 + fVar97 * local_2d00[2];
                            local_2680._12_4_ = fVar145 * fStack_2ad4 + fVar99 * local_2d00[3];
                            local_2680._16_4_ = fVar117 * fStack_2ad0 + fVar101 * fStack_2cf0;
                            local_2680._20_4_ = fVar118 * fStack_2acc + fVar84 * fStack_2cec;
                            local_2680._24_4_ = fVar119 * fStack_2ac8 + fVar132 * fStack_2ce8;
                            local_2680._28_4_ = auVar149._28_4_ + auVar109._28_4_;
                          }
                          auVar131 = local_2940;
                          auVar149 = *(undefined1 (*) [32])ray;
                          auVar102 = *(undefined1 (*) [32])(ray + 0x20);
                          auVar91 = *(undefined1 (*) [32])(ray + 0x40);
                          _local_2cc0 = vsubps_avx(auVar184._0_32_,auVar149);
                          _local_2c80 = vsubps_avx(auVar158,auVar102);
                          _local_2ba0 = vsubps_avx(auVar172,auVar91);
                          auVar109 = vsubps_avx(local_2640,auVar149);
                          auVar148 = vsubps_avx(local_2660,auVar102);
                          auVar161 = vsubps_avx(local_2680,auVar91);
                          local_2960 = vsubps_avx(auVar109,_local_2cc0);
                          local_29a0 = vsubps_avx(auVar148,_local_2c80);
                          local_2980 = vsubps_avx(auVar161,_local_2ba0);
                          auVar105._0_4_ = auVar109._0_4_ + local_2cc0._0_4_;
                          auVar105._4_4_ = auVar109._4_4_ + local_2cc0._4_4_;
                          auVar105._8_4_ = auVar109._8_4_ + local_2cc0._8_4_;
                          auVar105._12_4_ = auVar109._12_4_ + local_2cc0._12_4_;
                          auVar105._16_4_ = auVar109._16_4_ + local_2cc0._16_4_;
                          auVar105._20_4_ = auVar109._20_4_ + local_2cc0._20_4_;
                          auVar105._24_4_ = auVar109._24_4_ + local_2cc0._24_4_;
                          auVar105._28_4_ = auVar109._28_4_ + local_2cc0._28_4_;
                          auVar168._0_4_ = auVar148._0_4_ + local_2c80._0_4_;
                          auVar168._4_4_ = auVar148._4_4_ + local_2c80._4_4_;
                          auVar168._8_4_ = auVar148._8_4_ + local_2c80._8_4_;
                          auVar168._12_4_ = auVar148._12_4_ + local_2c80._12_4_;
                          auVar168._16_4_ = auVar148._16_4_ + local_2c80._16_4_;
                          auVar168._20_4_ = auVar148._20_4_ + local_2c80._20_4_;
                          auVar168._24_4_ = auVar148._24_4_ + local_2c80._24_4_;
                          fVar83 = local_2c80._28_4_;
                          auVar168._28_4_ = auVar148._28_4_ + fVar83;
                          fVar118 = local_2ba0._0_4_;
                          auVar240._0_4_ = fVar118 + auVar161._0_4_;
                          fVar119 = local_2ba0._4_4_;
                          auVar240._4_4_ = fVar119 + auVar161._4_4_;
                          fVar122 = local_2ba0._8_4_;
                          auVar240._8_4_ = fVar122 + auVar161._8_4_;
                          fVar134 = local_2ba0._12_4_;
                          auVar240._12_4_ = fVar134 + auVar161._12_4_;
                          fVar137 = local_2ba0._16_4_;
                          auVar240._16_4_ = fVar137 + auVar161._16_4_;
                          fVar140 = local_2ba0._20_4_;
                          auVar240._20_4_ = fVar140 + auVar161._20_4_;
                          fVar121 = local_2ba0._24_4_;
                          auVar240._24_4_ = fVar121 + auVar161._24_4_;
                          fVar120 = auVar161._28_4_;
                          auVar240._28_4_ = local_2ba0._28_4_ + fVar120;
                          auVar215._0_4_ = auVar168._0_4_ * local_2980._0_4_;
                          auVar215._4_4_ = auVar168._4_4_ * local_2980._4_4_;
                          auVar215._8_4_ = auVar168._8_4_ * local_2980._8_4_;
                          auVar215._12_4_ = auVar168._12_4_ * local_2980._12_4_;
                          auVar215._16_4_ = auVar168._16_4_ * local_2980._16_4_;
                          auVar215._20_4_ = auVar168._20_4_ * local_2980._20_4_;
                          auVar215._24_4_ = auVar168._24_4_ * local_2980._24_4_;
                          auVar215._28_36_ = auVar300;
                          auVar159 = vfmsub231ps_fma(auVar215._0_32_,local_29a0,auVar240);
                          auVar173._0_4_ = auVar240._0_4_ * local_2960._0_4_;
                          auVar173._4_4_ = auVar240._4_4_ * local_2960._4_4_;
                          auVar173._8_4_ = auVar240._8_4_ * local_2960._8_4_;
                          auVar173._12_4_ = auVar240._12_4_ * local_2960._12_4_;
                          auVar173._16_4_ = auVar240._16_4_ * local_2960._16_4_;
                          auVar173._20_4_ = auVar240._20_4_ * local_2960._20_4_;
                          auVar173._28_36_ = auVar184._28_36_;
                          auVar173._24_4_ = auVar240._24_4_ * local_2960._24_4_;
                          auVar123 = vfmsub231ps_fma(auVar173._0_32_,local_2980,auVar105);
                          auVar20._4_4_ = auVar105._4_4_ * local_29a0._4_4_;
                          auVar20._0_4_ = auVar105._0_4_ * local_29a0._0_4_;
                          auVar20._8_4_ = auVar105._8_4_ * local_29a0._8_4_;
                          auVar20._12_4_ = auVar105._12_4_ * local_29a0._12_4_;
                          auVar20._16_4_ = auVar105._16_4_ * local_29a0._16_4_;
                          auVar20._20_4_ = auVar105._20_4_ * local_29a0._20_4_;
                          auVar20._24_4_ = auVar105._24_4_ * local_29a0._24_4_;
                          auVar20._28_4_ = local_29a0._28_4_;
                          auVar8 = vfmsub231ps_fma(auVar20,local_2960,auVar168);
                          pRVar1 = ray + 0xc0;
                          fVar132 = *(float *)pRVar1;
                          fVar135 = *(float *)(ray + 0xc4);
                          fVar138 = *(float *)(ray + 200);
                          fVar141 = *(float *)(ray + 0xcc);
                          fVar143 = *(float *)(ray + 0xd0);
                          fVar145 = *(float *)(ray + 0xd4);
                          fVar117 = *(float *)(ray + 0xd8);
                          auVar65 = *(undefined1 (*) [28])pRVar1;
                          auVar21._4_4_ = fVar135 * auVar8._4_4_;
                          auVar21._0_4_ = fVar132 * auVar8._0_4_;
                          auVar21._8_4_ = fVar138 * auVar8._8_4_;
                          auVar21._12_4_ = fVar141 * auVar8._12_4_;
                          auVar21._16_4_ = fVar143 * 0.0;
                          auVar21._20_4_ = fVar145 * 0.0;
                          auVar21._24_4_ = fVar117 * 0.0;
                          auVar21._28_4_ = local_2980._28_4_;
                          local_2da0._0_32_ = *(undefined1 (*) [32])(ray + 0xa0);
                          auVar123 = vfmadd231ps_fma(auVar21,local_2da0._0_32_,ZEXT1632(auVar123));
                          local_29e0 = *(undefined1 (*) [32])(ray + 0x80);
                          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),local_29e0,
                                                     ZEXT1632(auVar159));
                          auVar215 = ZEXT1664(auVar123);
                          auVar149 = vsubps_avx(_local_2ca0,auVar149);
                          auVar102 = vsubps_avx(_local_2e00,auVar102);
                          auVar91 = vsubps_avx(_local_2de0,auVar91);
                          auVar154 = vsubps_avx(_local_2c80,auVar102);
                          in_ZMM13 = ZEXT3264(auVar154);
                          auVar237 = vsubps_avx(_local_2ba0,auVar91);
                          auVar293 = ZEXT3264(auVar237);
                          auVar169._0_4_ = local_2c80._0_4_ + auVar102._0_4_;
                          auVar169._4_4_ = local_2c80._4_4_ + auVar102._4_4_;
                          auVar169._8_4_ = local_2c80._8_4_ + auVar102._8_4_;
                          auVar169._12_4_ = local_2c80._12_4_ + auVar102._12_4_;
                          auVar169._16_4_ = local_2c80._16_4_ + auVar102._16_4_;
                          auVar169._20_4_ = local_2c80._20_4_ + auVar102._20_4_;
                          auVar169._24_4_ = local_2c80._24_4_ + auVar102._24_4_;
                          auVar169._28_4_ = fVar83 + auVar102._28_4_;
                          auVar268._0_4_ = fVar118 + auVar91._0_4_;
                          auVar268._4_4_ = fVar119 + auVar91._4_4_;
                          auVar268._8_4_ = fVar122 + auVar91._8_4_;
                          auVar268._12_4_ = fVar134 + auVar91._12_4_;
                          auVar268._16_4_ = fVar137 + auVar91._16_4_;
                          auVar268._20_4_ = fVar140 + auVar91._20_4_;
                          auVar268._24_4_ = fVar121 + auVar91._24_4_;
                          auVar268._28_4_ = local_2ba0._28_4_ + auVar91._28_4_;
                          fVar175 = auVar237._0_4_;
                          fVar176 = auVar237._4_4_;
                          auVar22._4_4_ = fVar176 * auVar169._4_4_;
                          auVar22._0_4_ = fVar175 * auVar169._0_4_;
                          fVar258 = auVar237._8_4_;
                          auVar22._8_4_ = fVar258 * auVar169._8_4_;
                          fVar261 = auVar237._12_4_;
                          auVar22._12_4_ = fVar261 * auVar169._12_4_;
                          fVar262 = auVar237._16_4_;
                          auVar22._16_4_ = fVar262 * auVar169._16_4_;
                          fVar263 = auVar237._20_4_;
                          auVar22._20_4_ = fVar263 * auVar169._20_4_;
                          fVar264 = auVar237._24_4_;
                          auVar22._24_4_ = fVar264 * auVar169._24_4_;
                          auVar22._28_4_ = fVar83;
                          auVar8 = vfmsub231ps_fma(auVar22,auVar154,auVar268);
                          auVar238 = vsubps_avx(_local_2cc0,auVar149);
                          in_ZMM14 = ZEXT3264(auVar238);
                          fVar83 = auVar238._0_4_;
                          fVar98 = auVar238._4_4_;
                          auVar23._4_4_ = auVar268._4_4_ * fVar98;
                          auVar23._0_4_ = auVar268._0_4_ * fVar83;
                          fVar100 = auVar238._8_4_;
                          auVar23._8_4_ = auVar268._8_4_ * fVar100;
                          fVar97 = auVar238._12_4_;
                          auVar23._12_4_ = auVar268._12_4_ * fVar97;
                          fVar99 = auVar238._16_4_;
                          auVar23._16_4_ = auVar268._16_4_ * fVar99;
                          fVar101 = auVar238._20_4_;
                          auVar23._20_4_ = auVar268._20_4_ * fVar101;
                          fVar84 = auVar238._24_4_;
                          auVar23._24_4_ = auVar268._24_4_ * fVar84;
                          auVar23._28_4_ = auVar268._28_4_;
                          auVar199._0_4_ = local_2cc0._0_4_ + auVar149._0_4_;
                          auVar199._4_4_ = local_2cc0._4_4_ + auVar149._4_4_;
                          auVar199._8_4_ = local_2cc0._8_4_ + auVar149._8_4_;
                          auVar199._12_4_ = local_2cc0._12_4_ + auVar149._12_4_;
                          auVar199._16_4_ = local_2cc0._16_4_ + auVar149._16_4_;
                          auVar199._20_4_ = local_2cc0._20_4_ + auVar149._20_4_;
                          auVar199._24_4_ = local_2cc0._24_4_ + auVar149._24_4_;
                          auVar199._28_4_ = local_2cc0._28_4_ + auVar149._28_4_;
                          auVar159 = vfmsub231ps_fma(auVar23,auVar237,auVar199);
                          fVar133 = auVar154._0_4_;
                          fVar136 = auVar154._4_4_;
                          auVar24._4_4_ = fVar136 * auVar199._4_4_;
                          auVar24._0_4_ = fVar133 * auVar199._0_4_;
                          fVar139 = auVar154._8_4_;
                          auVar24._8_4_ = fVar139 * auVar199._8_4_;
                          fVar142 = auVar154._12_4_;
                          auVar24._12_4_ = fVar142 * auVar199._12_4_;
                          fVar144 = auVar154._16_4_;
                          auVar24._16_4_ = fVar144 * auVar199._16_4_;
                          fVar146 = auVar154._20_4_;
                          auVar24._20_4_ = fVar146 * auVar199._20_4_;
                          fVar174 = auVar154._24_4_;
                          auVar24._24_4_ = fVar174 * auVar199._24_4_;
                          auVar24._28_4_ = auVar199._28_4_;
                          auVar259 = vfmsub231ps_fma(auVar24,auVar238,auVar169);
                          auVar25._4_4_ = fVar135 * auVar259._4_4_;
                          auVar25._0_4_ = fVar132 * auVar259._0_4_;
                          auVar25._8_4_ = fVar138 * auVar259._8_4_;
                          auVar25._12_4_ = fVar141 * auVar259._12_4_;
                          auVar25._16_4_ = fVar143 * 0.0;
                          auVar25._20_4_ = fVar145 * 0.0;
                          auVar25._24_4_ = fVar117 * 0.0;
                          auVar25._28_4_ = auVar169._28_4_;
                          auVar159 = vfmadd231ps_fma(auVar25,local_2da0._0_32_,ZEXT1632(auVar159));
                          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),local_29e0,ZEXT1632(auVar8))
                          ;
                          auVar110 = vsubps_avx(auVar149,auVar109);
                          auVar89._0_4_ = auVar109._0_4_ + auVar149._0_4_;
                          auVar89._4_4_ = auVar109._4_4_ + auVar149._4_4_;
                          auVar89._8_4_ = auVar109._8_4_ + auVar149._8_4_;
                          auVar89._12_4_ = auVar109._12_4_ + auVar149._12_4_;
                          auVar89._16_4_ = auVar109._16_4_ + auVar149._16_4_;
                          auVar89._20_4_ = auVar109._20_4_ + auVar149._20_4_;
                          auVar89._24_4_ = auVar109._24_4_ + auVar149._24_4_;
                          auVar89._28_4_ = auVar109._28_4_ + auVar149._28_4_;
                          auVar109 = vsubps_avx(auVar102,auVar148);
                          auVar127._0_4_ = auVar148._0_4_ + auVar102._0_4_;
                          auVar127._4_4_ = auVar148._4_4_ + auVar102._4_4_;
                          auVar127._8_4_ = auVar148._8_4_ + auVar102._8_4_;
                          auVar127._12_4_ = auVar148._12_4_ + auVar102._12_4_;
                          auVar127._16_4_ = auVar148._16_4_ + auVar102._16_4_;
                          auVar127._20_4_ = auVar148._20_4_ + auVar102._20_4_;
                          auVar127._24_4_ = auVar148._24_4_ + auVar102._24_4_;
                          auVar127._28_4_ = auVar148._28_4_ + auVar102._28_4_;
                          auVar148 = vsubps_avx(auVar91,auVar161);
                          auVar106._0_4_ = auVar91._0_4_ + auVar161._0_4_;
                          auVar106._4_4_ = auVar91._4_4_ + auVar161._4_4_;
                          auVar106._8_4_ = auVar91._8_4_ + auVar161._8_4_;
                          auVar106._12_4_ = auVar91._12_4_ + auVar161._12_4_;
                          auVar106._16_4_ = auVar91._16_4_ + auVar161._16_4_;
                          auVar106._20_4_ = auVar91._20_4_ + auVar161._20_4_;
                          auVar106._24_4_ = auVar91._24_4_ + auVar161._24_4_;
                          auVar106._28_4_ = auVar91._28_4_ + fVar120;
                          auVar26._4_4_ = auVar148._4_4_ * auVar127._4_4_;
                          auVar26._0_4_ = auVar148._0_4_ * auVar127._0_4_;
                          auVar26._8_4_ = auVar148._8_4_ * auVar127._8_4_;
                          auVar26._12_4_ = auVar148._12_4_ * auVar127._12_4_;
                          auVar26._16_4_ = auVar148._16_4_ * auVar127._16_4_;
                          auVar26._20_4_ = auVar148._20_4_ * auVar127._20_4_;
                          auVar26._24_4_ = auVar148._24_4_ * auVar127._24_4_;
                          auVar26._28_4_ = fVar120;
                          auVar259 = vfmsub231ps_fma(auVar26,auVar109,auVar106);
                          auVar27._4_4_ = auVar110._4_4_ * auVar106._4_4_;
                          auVar27._0_4_ = auVar110._0_4_ * auVar106._0_4_;
                          auVar27._8_4_ = auVar110._8_4_ * auVar106._8_4_;
                          auVar27._12_4_ = auVar110._12_4_ * auVar106._12_4_;
                          auVar27._16_4_ = auVar110._16_4_ * auVar106._16_4_;
                          auVar27._20_4_ = auVar110._20_4_ * auVar106._20_4_;
                          auVar27._24_4_ = auVar110._24_4_ * auVar106._24_4_;
                          auVar27._28_4_ = auVar106._28_4_;
                          auVar8 = vfmsub231ps_fma(auVar27,auVar148,auVar89);
                          auVar28._4_4_ = auVar109._4_4_ * auVar89._4_4_;
                          auVar28._0_4_ = auVar109._0_4_ * auVar89._0_4_;
                          auVar28._8_4_ = auVar109._8_4_ * auVar89._8_4_;
                          auVar28._12_4_ = auVar109._12_4_ * auVar89._12_4_;
                          auVar28._16_4_ = auVar109._16_4_ * auVar89._16_4_;
                          auVar28._20_4_ = auVar109._20_4_ * auVar89._20_4_;
                          auVar28._24_4_ = auVar109._24_4_ * auVar89._24_4_;
                          auVar28._28_4_ = auVar89._28_4_;
                          auVar160 = vfmsub231ps_fma(auVar28,auVar110,auVar127);
                          _local_29c0 = *(undefined1 (*) [32])pRVar1;
                          auVar90._0_4_ = fVar132 * auVar160._0_4_;
                          auVar90._4_4_ = fVar135 * auVar160._4_4_;
                          auVar90._8_4_ = fVar138 * auVar160._8_4_;
                          auVar90._12_4_ = fVar141 * auVar160._12_4_;
                          auVar90._16_4_ = fVar143 * 0.0;
                          auVar90._20_4_ = fVar145 * 0.0;
                          auVar90._24_4_ = fVar117 * 0.0;
                          auVar90._28_4_ = 0;
                          auVar8 = vfmadd231ps_fma(auVar90,local_2da0._0_32_,ZEXT1632(auVar8));
                          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),local_29e0,ZEXT1632(auVar259));
                          auVar96 = ZEXT1632(CONCAT412(auVar8._12_4_ +
                                                       auVar123._12_4_ + auVar159._12_4_,
                                                       CONCAT48(auVar8._8_4_ +
                                                                auVar123._8_4_ + auVar159._8_4_,
                                                                CONCAT44(auVar8._4_4_ +
                                                                         auVar123._4_4_ +
                                                                         auVar159._4_4_,
                                                                         auVar8._0_4_ +
                                                                         auVar123._0_4_ +
                                                                         auVar159._0_4_))));
                          auVar184 = ZEXT3264(auVar96);
                          local_26a0 = ZEXT1632(auVar123);
                          auVar149 = vminps_avx(local_26a0,ZEXT1632(auVar159));
                          auVar149 = vminps_avx(auVar149,ZEXT1632(auVar8));
                          auVar201 = ZEXT3264(local_2940);
                          local_26c0 = vandps_avx(auVar96,local_2940);
                          auVar259._8_4_ = 0x80000000;
                          auVar259._0_8_ = 0x8000000080000000;
                          auVar259._12_4_ = 0x80000000;
                          fStack_2c50 = -0.0;
                          _local_2c60 = auVar259;
                          fStack_2c4c = -0.0;
                          fStack_2c48 = -0.0;
                          fStack_2c44 = -0.0;
                          fVar120 = local_26c0._0_4_ * 1.1920929e-07;
                          fVar132 = local_26c0._4_4_ * 1.1920929e-07;
                          auVar29._4_4_ = fVar132;
                          auVar29._0_4_ = fVar120;
                          fVar135 = local_26c0._8_4_ * 1.1920929e-07;
                          auVar29._8_4_ = fVar135;
                          fVar138 = local_26c0._12_4_ * 1.1920929e-07;
                          auVar29._12_4_ = fVar138;
                          fVar141 = local_26c0._16_4_ * 1.1920929e-07;
                          auVar29._16_4_ = fVar141;
                          fVar143 = local_26c0._20_4_ * 1.1920929e-07;
                          auVar29._20_4_ = fVar143;
                          fVar145 = local_26c0._24_4_ * 1.1920929e-07;
                          auVar29._24_4_ = fVar145;
                          auVar29._28_4_ = 0x34000000;
                          auVar152._0_8_ = CONCAT44(fVar132,fVar120) ^ 0x8000000080000000;
                          auVar152._8_4_ = -fVar135;
                          auVar152._12_4_ = -fVar138;
                          auVar152._16_4_ = -fVar141;
                          auVar152._20_4_ = -fVar143;
                          auVar152._24_4_ = -fVar145;
                          auVar152._28_4_ = 0xb4000000;
                          auVar149 = vcmpps_avx(auVar149,auVar152,5);
                          auVar116 = ZEXT3264(auVar149);
                          local_26e0 = ZEXT1632(auVar159);
                          auVar91 = vmaxps_avx(local_26a0,ZEXT1632(auVar159));
                          auVar102 = vmaxps_avx(auVar91,ZEXT1632(auVar8));
                          auVar102 = vcmpps_avx(auVar102,auVar29,2);
                          auVar102 = vorps_avx(auVar149,auVar102);
                          auVar173 = ZEXT3264(local_2c40);
                          auVar161 = local_2c40 & auVar102;
                          pRVar78 = pRVar71;
                          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar161 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar161 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar161 >> 0x7f,0) == '\0') &&
                                (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar161 >> 0xbf,0) == '\0') &&
                              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar161[0x1f]) {
LAB_005bc31a:
                            auVar260 = ZEXT3264(_local_2c60);
                            auVar251 = ZEXT3264(_local_2e00);
                            auVar229 = ZEXT3264(_local_2de0);
                            auVar149 = local_2c40;
                          }
                          else {
                            local_2700 = auVar96;
                            local_2a00 = auVar102;
                            auVar30._4_4_ = fVar136 * local_2980._4_4_;
                            auVar30._0_4_ = fVar133 * local_2980._0_4_;
                            auVar30._8_4_ = fVar139 * local_2980._8_4_;
                            auVar30._12_4_ = fVar142 * local_2980._12_4_;
                            auVar30._16_4_ = fVar144 * local_2980._16_4_;
                            auVar30._20_4_ = fVar146 * local_2980._20_4_;
                            auVar30._24_4_ = fVar174 * local_2980._24_4_;
                            auVar30._28_4_ = auVar102._28_4_;
                            auVar31._4_4_ = fVar98 * local_29a0._4_4_;
                            auVar31._0_4_ = fVar83 * local_29a0._0_4_;
                            auVar31._8_4_ = fVar100 * local_29a0._8_4_;
                            auVar31._12_4_ = fVar97 * local_29a0._12_4_;
                            auVar31._16_4_ = fVar99 * local_29a0._16_4_;
                            auVar31._20_4_ = fVar101 * local_29a0._20_4_;
                            auVar31._24_4_ = fVar84 * local_29a0._24_4_;
                            auVar31._28_4_ = auVar149._28_4_;
                            auVar8 = vfmsub213ps_fma(local_29a0,auVar237,auVar30);
                            auVar32._4_4_ = auVar109._4_4_ * fVar176;
                            auVar32._0_4_ = auVar109._0_4_ * fVar175;
                            auVar32._8_4_ = auVar109._8_4_ * fVar258;
                            auVar32._12_4_ = auVar109._12_4_ * fVar261;
                            auVar32._16_4_ = auVar109._16_4_ * fVar262;
                            auVar32._20_4_ = auVar109._20_4_ * fVar263;
                            auVar32._24_4_ = auVar109._24_4_ * fVar264;
                            auVar32._28_4_ = 0x34000000;
                            auVar33._4_4_ = fVar98 * auVar148._4_4_;
                            auVar33._0_4_ = fVar83 * auVar148._0_4_;
                            auVar33._8_4_ = fVar100 * auVar148._8_4_;
                            auVar33._12_4_ = fVar97 * auVar148._12_4_;
                            auVar33._16_4_ = fVar99 * auVar148._16_4_;
                            auVar33._20_4_ = fVar101 * auVar148._20_4_;
                            auVar33._24_4_ = fVar84 * auVar148._24_4_;
                            auVar33._28_4_ = auVar91._28_4_;
                            auVar160 = vfmsub213ps_fma(auVar148,auVar154,auVar32);
                            auVar149 = vandps_avx(auVar30,local_2940);
                            auVar91 = vandps_avx(auVar32,local_2940);
                            auVar149 = vcmpps_avx(auVar149,auVar91,1);
                            auVar148 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar8),auVar149);
                            auVar34._4_4_ = auVar110._4_4_ * fVar136;
                            auVar34._0_4_ = auVar110._0_4_ * fVar133;
                            auVar34._8_4_ = auVar110._8_4_ * fVar139;
                            auVar34._12_4_ = auVar110._12_4_ * fVar142;
                            auVar34._16_4_ = auVar110._16_4_ * fVar144;
                            auVar34._20_4_ = auVar110._20_4_ * fVar146;
                            auVar34._24_4_ = auVar110._24_4_ * fVar174;
                            auVar34._28_4_ = auVar149._28_4_;
                            auVar8 = vfmsub213ps_fma(auVar110,auVar237,auVar33);
                            auVar35._4_4_ = fVar176 * local_2960._4_4_;
                            auVar35._0_4_ = fVar175 * local_2960._0_4_;
                            auVar35._8_4_ = fVar258 * local_2960._8_4_;
                            auVar35._12_4_ = fVar261 * local_2960._12_4_;
                            auVar35._16_4_ = fVar262 * local_2960._16_4_;
                            auVar35._20_4_ = fVar263 * local_2960._20_4_;
                            auVar35._24_4_ = fVar264 * local_2960._24_4_;
                            auVar35._28_4_ = auVar91._28_4_;
                            auVar160 = vfmsub213ps_fma(local_2980,auVar238,auVar35);
                            auVar149 = vandps_avx(auVar35,local_2940);
                            auVar91 = vandps_avx(auVar33,local_2940);
                            auVar149 = vcmpps_avx(auVar149,auVar91,1);
                            auVar161 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar160),auVar149);
                            auVar293 = ZEXT3264(auVar161);
                            auVar8 = vfmsub213ps_fma(local_2960,auVar154,auVar31);
                            auVar215 = ZEXT1664(auVar8);
                            auVar160 = vfmsub213ps_fma(auVar109,auVar238,auVar34);
                            auVar149 = vandps_avx(auVar31,local_2940);
                            auVar91 = vandps_avx(auVar34,local_2940);
                            auVar91 = vcmpps_avx(auVar149,auVar91,1);
                            auVar109 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar8),auVar91);
                            in_ZMM13 = ZEXT3264(auVar109);
                            local_29c0._0_4_ = auVar65._0_4_;
                            local_29c0._4_4_ = auVar65._4_4_;
                            fStack_29b8 = auVar65._8_4_;
                            fStack_29b4 = auVar65._12_4_;
                            fStack_29b0 = auVar65._16_4_;
                            fStack_29ac = auVar65._20_4_;
                            fStack_29a8 = auVar65._24_4_;
                            auVar36._4_4_ = auVar109._4_4_ * (float)local_29c0._4_4_;
                            auVar36._0_4_ = auVar109._0_4_ * (float)local_29c0._0_4_;
                            auVar36._8_4_ = auVar109._8_4_ * fStack_29b8;
                            auVar36._12_4_ = auVar109._12_4_ * fStack_29b4;
                            auVar36._16_4_ = auVar109._16_4_ * fStack_29b0;
                            auVar36._20_4_ = auVar109._20_4_ * fStack_29ac;
                            auVar36._24_4_ = auVar109._24_4_ * fStack_29a8;
                            auVar36._28_4_ = auVar91._28_4_;
                            auVar8 = vfmadd213ps_fma(local_2da0._0_32_,auVar161,auVar36);
                            auVar8 = vfmadd213ps_fma(local_29e0,auVar148,ZEXT1632(auVar8));
                            fVar83 = auVar8._0_4_ + auVar8._0_4_;
                            fVar120 = auVar8._4_4_ + auVar8._4_4_;
                            fVar98 = auVar8._8_4_ + auVar8._8_4_;
                            fVar100 = auVar8._12_4_ + auVar8._12_4_;
                            auVar110 = ZEXT1632(CONCAT412(fVar100,CONCAT48(fVar98,CONCAT44(fVar120,
                                                  fVar83))));
                            auVar37._4_4_ = auVar109._4_4_ * fVar119;
                            auVar37._0_4_ = auVar109._0_4_ * fVar118;
                            auVar37._8_4_ = auVar109._8_4_ * fVar122;
                            auVar37._12_4_ = auVar109._12_4_ * fVar134;
                            auVar37._16_4_ = auVar109._16_4_ * fVar137;
                            auVar37._20_4_ = auVar109._20_4_ * fVar140;
                            auVar37._24_4_ = auVar109._24_4_ * fVar121;
                            auVar37._28_4_ = auVar149._28_4_;
                            auVar8 = vfmadd213ps_fma(_local_2c80,auVar161,auVar37);
                            auVar160 = vfmadd213ps_fma(_local_2cc0,auVar148,ZEXT1632(auVar8));
                            auVar149 = vrcpps_avx(auVar110);
                            auVar225._8_4_ = 0x3f800000;
                            auVar225._0_8_ = &DAT_3f8000003f800000;
                            auVar225._12_4_ = 0x3f800000;
                            auVar225._16_4_ = 0x3f800000;
                            auVar225._20_4_ = 0x3f800000;
                            auVar225._24_4_ = 0x3f800000;
                            auVar225._28_4_ = 0x3f800000;
                            auVar8 = vfnmadd213ps_fma(auVar149,auVar110,auVar225);
                            auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar149,auVar149);
                            auVar237 = ZEXT1632(CONCAT412((auVar160._12_4_ + auVar160._12_4_) *
                                                          auVar8._12_4_,
                                                          CONCAT48((auVar160._8_4_ + auVar160._8_4_)
                                                                   * auVar8._8_4_,
                                                                   CONCAT44((auVar160._4_4_ +
                                                                            auVar160._4_4_) *
                                                                            auVar8._4_4_,
                                                                            (auVar160._0_4_ +
                                                                            auVar160._0_4_) *
                                                                            auVar8._0_4_))));
                            auVar116 = ZEXT3264(auVar237);
                            auVar149 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar184 = ZEXT3264(auVar149);
                            auVar91 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar237,2);
                            auVar154 = vcmpps_avx(auVar237,auVar149,2);
                            auVar91 = vandps_avx(auVar91,auVar154);
                            auVar260 = ZEXT3264(_local_2c60);
                            auVar153._0_8_ = CONCAT44(fVar120,fVar83) ^ 0x8000000080000000;
                            auVar153._8_4_ = -fVar98;
                            auVar153._12_4_ = -fVar100;
                            auVar153._16_4_ = 0x80000000;
                            auVar153._20_4_ = 0x80000000;
                            auVar153._24_4_ = 0x80000000;
                            auVar153._28_4_ = 0x80000000;
                            auVar154 = vcmpps_avx(auVar110,auVar153,4);
                            auVar91 = vandps_avx(auVar154,auVar91);
                            auVar102 = vandps_avx(local_2c40,auVar102);
                            auVar91 = vpslld_avx2(auVar91,0x1f);
                            auVar154 = vpsrad_avx2(auVar91,0x1f);
                            auVar91 = auVar102 & auVar154;
                            if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar91 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar91 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar91 >> 0x7f,0) == '\0') &&
                                  (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar91 >> 0xbf,0) == '\0') &&
                                (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar91[0x1f]) goto LAB_005bc31a;
                            auVar102 = vandps_avx(auVar154,auVar102);
                            uVar81 = ((Geometry *)auVar75)->mask;
                            auVar92._4_4_ = uVar81;
                            auVar92._0_4_ = uVar81;
                            auVar92._8_4_ = uVar81;
                            auVar92._12_4_ = uVar81;
                            auVar92._16_4_ = uVar81;
                            auVar92._20_4_ = uVar81;
                            auVar92._24_4_ = uVar81;
                            auVar92._28_4_ = uVar81;
                            auVar91 = vpand_avx2(auVar92,*(undefined1 (*) [32])(ray + 0x120));
                            auVar154 = vpcmpeqd_avx2(auVar91,_DAT_02020f00);
                            auVar91 = auVar102 & ~auVar154;
                            if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar91 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar91 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar91 >> 0x7f,0) == '\0') &&
                                  (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar91 >> 0xbf,0) == '\0') &&
                                (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar91[0x1f]) goto LAB_005bc31a;
                            auVar102 = vandnps_avx(auVar154,auVar102);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (((Geometry *)auVar75)->occlusionFilterN == (RTCFilterFunctionN)0x0))
                            {
                              auVar251 = ZEXT3264(_local_2e00);
                              auVar229 = ZEXT3264(_local_2de0);
                            }
                            else {
                              auVar91 = vrcpps_avx(auVar96);
                              auVar228._8_4_ = 0x3f800000;
                              auVar228._0_8_ = &DAT_3f8000003f800000;
                              auVar228._12_4_ = 0x3f800000;
                              auVar228._16_4_ = 0x3f800000;
                              auVar228._20_4_ = 0x3f800000;
                              auVar228._24_4_ = 0x3f800000;
                              auVar228._28_4_ = 0x3f800000;
                              auVar8 = vfnmadd213ps_fma(auVar96,auVar91,auVar228);
                              auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar91,auVar91);
                              auVar94._8_4_ = 0x219392ef;
                              auVar94._0_8_ = 0x219392ef219392ef;
                              auVar94._12_4_ = 0x219392ef;
                              auVar94._16_4_ = 0x219392ef;
                              auVar94._20_4_ = 0x219392ef;
                              auVar94._24_4_ = 0x219392ef;
                              auVar94._28_4_ = 0x219392ef;
                              auVar91 = vcmpps_avx(local_26c0,auVar94,5);
                              auVar91 = vandps_avx(auVar91,ZEXT1632(auVar8));
                              auVar56._4_4_ = auVar91._4_4_ * auVar123._4_4_;
                              auVar56._0_4_ = auVar91._0_4_ * auVar123._0_4_;
                              auVar56._8_4_ = auVar91._8_4_ * auVar123._8_4_;
                              auVar56._12_4_ = auVar91._12_4_ * auVar123._12_4_;
                              auVar56._16_4_ = auVar91._16_4_ * 0.0;
                              auVar56._20_4_ = auVar91._20_4_ * 0.0;
                              auVar56._24_4_ = auVar91._24_4_ * 0.0;
                              auVar56._28_4_ = local_26c0._28_4_;
                              auVar154 = vminps_avx(auVar56,auVar228);
                              auVar57._4_4_ = auVar91._4_4_ * auVar159._4_4_;
                              auVar57._0_4_ = auVar91._0_4_ * auVar159._0_4_;
                              auVar57._8_4_ = auVar91._8_4_ * auVar159._8_4_;
                              auVar57._12_4_ = auVar91._12_4_ * auVar159._12_4_;
                              auVar57._16_4_ = auVar91._16_4_ * 0.0;
                              auVar57._20_4_ = auVar91._20_4_ * 0.0;
                              auVar57._24_4_ = auVar91._24_4_ * 0.0;
                              auVar57._28_4_ = auVar91._28_4_;
                              auVar91 = vminps_avx(auVar57,auVar228);
                              auVar110 = vsubps_avx(auVar228,auVar154);
                              auVar96 = vsubps_avx(auVar228,auVar91);
                              auVar123._8_8_ = uStack_2738;
                              auVar123._0_8_ = local_2740;
                              auVar64._16_8_ = uStack_2730;
                              auVar64._0_16_ = auVar123;
                              auVar64._24_8_ = uStack_2728;
                              auVar215 = ZEXT3264(auVar64);
                              local_2ac0 = vblendvps_avx(auVar154,auVar110,auVar64);
                              local_2aa0 = vblendvps_avx(auVar91,auVar96,auVar64);
                              pRVar5 = context->user;
                              auVar159._4_4_ = (undefined4)local_2bf0;
                              auVar159._0_4_ = (undefined4)local_2bf0;
                              auVar159._8_4_ = (undefined4)local_2bf0;
                              auVar159._12_4_ = (undefined4)local_2bf0;
                              local_2a60._16_4_ = (undefined4)local_2bf0;
                              local_2a60._0_16_ = auVar159;
                              local_2a60._20_4_ = (undefined4)local_2bf0;
                              local_2a60._24_4_ = (undefined4)local_2bf0;
                              local_2a60._28_4_ = (undefined4)local_2bf0;
                              auVar173 = ZEXT3264(local_2a60);
                              _local_2b20 = auVar148;
                              _local_2b00 = auVar161;
                              _local_2ae0 = auVar109;
                              local_2a80._4_4_ = iVar67;
                              local_2a80._0_4_ = iVar67;
                              local_2a80._8_4_ = iVar67;
                              local_2a80._12_4_ = iVar67;
                              local_2a80._16_4_ = iVar67;
                              local_2a80._20_4_ = iVar67;
                              local_2a80._24_4_ = iVar67;
                              local_2a80._28_4_ = iVar67;
                              RVar6 = (RTCIntersectArguments)vpcmpeqd_avx2(local_2aa0,local_2aa0);
                              local_2cc8[1] = RVar6;
                              *local_2cc8 = RVar6;
                              local_2a40.flags = pRVar5->instID[0];
                              local_2a40.feature_mask = local_2a40.flags;
                              local_2a40.context._0_4_ = local_2a40.flags;
                              local_2a40.context._4_4_ = local_2a40.flags;
                              local_2a40.filter._0_4_ = local_2a40.flags;
                              local_2a40.filter._4_4_ = local_2a40.flags;
                              local_2a40.intersect._0_4_ = local_2a40.flags;
                              local_2a40.intersect._4_4_ = local_2a40.flags;
                              local_2a20 = pRVar5->instPrimID[0];
                              uStack_2a1c = local_2a20;
                              uStack_2a18 = local_2a20;
                              uStack_2a14 = local_2a20;
                              uStack_2a10 = local_2a20;
                              uStack_2a0c = local_2a20;
                              uStack_2a08 = local_2a20;
                              uStack_2a04 = local_2a20;
                              auVar91 = vblendvps_avx(auVar149,auVar237,auVar102);
                              *(undefined1 (*) [32])(ray + 0x100) = auVar91;
                              local_2d60 = auVar102;
                              local_2d40 = (undefined1  [8])local_2d60;
                              uStack_2d38 = ((Geometry *)auVar75)->userPtr;
                              uStack_2d30 = context->user;
                              pRStack_2d28 = ray;
                              local_2d20 = (RTCHitN *)local_2b20;
                              fStack_2d18 = 1.12104e-44;
                              if (((Geometry *)auVar75)->occlusionFilterN != (RTCFilterFunctionN)0x0
                                 ) {
                                local_2da0._0_8_ = pRVar71;
                                local_2c80 = auVar75;
                                auVar173 = ZEXT1664(auVar159);
                                auVar201 = ZEXT1664(auVar131._0_16_);
                                auVar215 = ZEXT1664(auVar123);
                                auVar260 = ZEXT1664(auVar259);
                                in_ZMM13 = ZEXT1664(auVar109._0_16_);
                                in_ZMM14 = ZEXT1664(auVar238._0_16_);
                                auVar293 = ZEXT1664(auVar161._0_16_);
                                _local_2cc0 = auVar149;
                                (*((Geometry *)auVar75)->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_2d40);
                                auVar229._8_56_ = extraout_var;
                                auVar229._0_8_ = extraout_XMM1_Qa;
                                auVar237 = auVar229._0_32_;
                                auVar184 = ZEXT3264(_local_2cc0);
                                auVar75 = local_2c80;
                                pRVar78 = (RTCIntersectArguments *)local_2da0._0_8_;
                              }
                              auVar102 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2d60);
                              auVar113 = vpcmpeqd_avx2(auVar237,auVar237);
                              auVar149 = auVar113 & ~auVar102;
                              if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar149 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar149 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar149 >> 0x7f,0) == '\0')
                                    && (auVar149 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar149 >> 0xbf,0) == '\0')
                                  && (auVar149 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar149[0x1f]) {
                                auVar102 = auVar102 ^ auVar113;
                                auVar251 = ZEXT3264(_local_2e00);
                                auVar229 = ZEXT3264(_local_2de0);
                              }
                              else {
                                pRVar71 = context->args;
                                auVar251 = ZEXT3264(_local_2e00);
                                auVar229 = ZEXT3264(_local_2de0);
                                if ((pRVar71->filter != (RTCFilterFunctionN)0x0) &&
                                   ((((ulong)*(Geometry **)&pRVar71->flags & 2) != 0 ||
                                    (((((Geometry *)auVar75)->field_8).field_0x2 & 0x40) != 0)))) {
                                  local_2da0._0_8_ = pRVar78;
                                  _local_2cc0 = auVar184._0_32_;
                                  auVar173 = ZEXT1664(auVar173._0_16_);
                                  auVar201 = ZEXT1664(auVar201._0_16_);
                                  auVar215 = ZEXT1664(auVar215._0_16_);
                                  auVar260 = ZEXT1664(auVar260._0_16_);
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  auVar293 = ZEXT1664(auVar293._0_16_);
                                  (*pRVar71->filter)((RTCFilterFunctionNArguments *)local_2d40);
                                  auVar184 = ZEXT3264(_local_2cc0);
                                  auVar229 = ZEXT3264(_local_2de0);
                                  auVar251 = ZEXT3264(_local_2e00);
                                  pRVar78 = (RTCIntersectArguments *)local_2da0._0_8_;
                                }
                                auVar149 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                         local_2d60);
                                auVar102 = auVar149 ^ _DAT_0205a980;
                                auVar113._8_4_ = 0xff800000;
                                auVar113._0_8_ = 0xff800000ff800000;
                                auVar113._12_4_ = 0xff800000;
                                auVar113._16_4_ = 0xff800000;
                                auVar113._20_4_ = 0xff800000;
                                auVar113._24_4_ = 0xff800000;
                                auVar113._28_4_ = 0xff800000;
                                auVar149 = vblendvps_avx(auVar113,*(undefined1 (*) [32])
                                                                   (pRStack_2d28 + 0x100),auVar149);
                                *(undefined1 (*) [32])(pRStack_2d28 + 0x100) = auVar149;
                              }
                              auVar116 = ZEXT3264(auVar113);
                              auVar149 = vblendvps_avx(auVar184._0_32_,
                                                       *(undefined1 (*) [32])local_2d68,auVar102);
                              *(undefined1 (*) [32])local_2d68 = auVar149;
                            }
                            auVar149 = vandnps_avx(auVar102,local_2c40);
                          }
                          auVar270 = ZEXT3264(auVar149);
                          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar149 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar149 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar149 >> 0x7f,0) == '\0') &&
                                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar149 >> 0xbf,0) == '\0') &&
                              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar149[0x1f]) {
                            bVar82 = false;
                            auVar241 = ZEXT3264(local_2be0);
                          }
                          else {
                            auVar102 = *(undefined1 (*) [32])ray;
                            auVar91 = *(undefined1 (*) [32])(ray + 0x20);
                            auVar109 = *(undefined1 (*) [32])(ray + 0x40);
                            _local_2cc0 = vsubps_avx(_local_2b40,auVar102);
                            _local_2c80 = vsubps_avx(_local_2b60,auVar91);
                            _local_2ba0 = vsubps_avx(_local_2b80,auVar109);
                            auVar148 = vsubps_avx(local_2640,auVar102);
                            auVar161 = vsubps_avx(local_2660,auVar91);
                            auVar154 = vsubps_avx(local_2680,auVar109);
                            auVar237 = vsubps_avx(_local_2ca0,auVar102);
                            auVar91 = vsubps_avx(auVar251._0_32_,auVar91);
                            auVar109 = vsubps_avx(auVar229._0_32_,auVar109);
                            local_2960 = vsubps_avx(auVar237,_local_2cc0);
                            local_29a0 = vsubps_avx(auVar91,_local_2c80);
                            local_2980 = vsubps_avx(auVar109,_local_2ba0);
                            auVar226._0_4_ = auVar237._0_4_ + local_2cc0._0_4_;
                            auVar226._4_4_ = auVar237._4_4_ + local_2cc0._4_4_;
                            auVar226._8_4_ = auVar237._8_4_ + local_2cc0._8_4_;
                            auVar226._12_4_ = auVar237._12_4_ + local_2cc0._12_4_;
                            auVar226._16_4_ = auVar237._16_4_ + local_2cc0._16_4_;
                            auVar226._20_4_ = auVar237._20_4_ + local_2cc0._20_4_;
                            auVar226._24_4_ = auVar237._24_4_ + local_2cc0._24_4_;
                            auVar226._28_4_ = auVar237._28_4_ + local_2cc0._28_4_;
                            auVar250._0_4_ = auVar91._0_4_ + local_2c80._0_4_;
                            auVar250._4_4_ = auVar91._4_4_ + local_2c80._4_4_;
                            auVar250._8_4_ = auVar91._8_4_ + local_2c80._8_4_;
                            auVar250._12_4_ = auVar91._12_4_ + local_2c80._12_4_;
                            auVar250._16_4_ = auVar91._16_4_ + local_2c80._16_4_;
                            auVar250._20_4_ = auVar91._20_4_ + local_2c80._20_4_;
                            auVar250._24_4_ = auVar91._24_4_ + local_2c80._24_4_;
                            auVar250._28_4_ = auVar91._28_4_ + local_2c80._28_4_;
                            local_2c40 = auVar149;
                            fVar83 = local_2ba0._0_4_;
                            auVar269._0_4_ = auVar109._0_4_ + fVar83;
                            fVar120 = local_2ba0._4_4_;
                            auVar269._4_4_ = auVar109._4_4_ + fVar120;
                            fVar98 = local_2ba0._8_4_;
                            auVar269._8_4_ = auVar109._8_4_ + fVar98;
                            fVar100 = local_2ba0._12_4_;
                            auVar269._12_4_ = auVar109._12_4_ + fVar100;
                            fVar97 = local_2ba0._16_4_;
                            auVar269._16_4_ = auVar109._16_4_ + fVar97;
                            fVar99 = local_2ba0._20_4_;
                            auVar269._20_4_ = auVar109._20_4_ + fVar99;
                            fVar101 = local_2ba0._24_4_;
                            auVar269._24_4_ = auVar109._24_4_ + fVar101;
                            fVar84 = local_2ba0._28_4_;
                            auVar269._28_4_ = auVar109._28_4_ + fVar84;
                            auVar251._0_4_ = auVar250._0_4_ * local_2980._0_4_;
                            auVar251._4_4_ = auVar250._4_4_ * local_2980._4_4_;
                            auVar251._8_4_ = auVar250._8_4_ * local_2980._8_4_;
                            auVar251._12_4_ = auVar250._12_4_ * local_2980._12_4_;
                            auVar251._16_4_ = auVar250._16_4_ * local_2980._16_4_;
                            auVar251._20_4_ = auVar250._20_4_ * local_2980._20_4_;
                            auVar251._28_36_ = in_ZMM13._28_36_;
                            auVar251._24_4_ = auVar250._24_4_ * local_2980._24_4_;
                            auVar159 = vfmsub231ps_fma(auVar251._0_32_,local_29a0,auVar269);
                            auVar38._4_4_ = auVar269._4_4_ * local_2960._4_4_;
                            auVar38._0_4_ = auVar269._0_4_ * local_2960._0_4_;
                            auVar38._8_4_ = auVar269._8_4_ * local_2960._8_4_;
                            auVar38._12_4_ = auVar269._12_4_ * local_2960._12_4_;
                            auVar38._16_4_ = auVar269._16_4_ * local_2960._16_4_;
                            auVar38._20_4_ = auVar269._20_4_ * local_2960._20_4_;
                            auVar38._24_4_ = auVar269._24_4_ * local_2960._24_4_;
                            auVar38._28_4_ = auVar269._28_4_;
                            auVar123 = vfmsub231ps_fma(auVar38,local_2980,auVar226);
                            auVar39._4_4_ = auVar226._4_4_ * local_29a0._4_4_;
                            auVar39._0_4_ = auVar226._0_4_ * local_29a0._0_4_;
                            auVar39._8_4_ = auVar226._8_4_ * local_29a0._8_4_;
                            auVar39._12_4_ = auVar226._12_4_ * local_29a0._12_4_;
                            auVar39._16_4_ = auVar226._16_4_ * local_29a0._16_4_;
                            auVar39._20_4_ = auVar226._20_4_ * local_29a0._20_4_;
                            auVar39._24_4_ = auVar226._24_4_ * local_29a0._24_4_;
                            auVar39._28_4_ = auVar226._28_4_;
                            auVar8 = vfmsub231ps_fma(auVar39,local_2960,auVar250);
                            pRVar1 = ray + 0xc0;
                            fVar121 = *(float *)pRVar1;
                            fVar133 = *(float *)(ray + 0xc4);
                            fVar136 = *(float *)(ray + 200);
                            fVar139 = *(float *)(ray + 0xcc);
                            fVar142 = *(float *)(ray + 0xd0);
                            fVar144 = *(float *)(ray + 0xd4);
                            fVar146 = *(float *)(ray + 0xd8);
                            auVar65 = *(undefined1 (*) [28])pRVar1;
                            auVar96 = *(undefined1 (*) [32])pRVar1;
                            auVar40._4_4_ = auVar8._4_4_ * fVar133;
                            auVar40._0_4_ = auVar8._0_4_ * fVar121;
                            auVar40._8_4_ = auVar8._8_4_ * fVar136;
                            auVar40._12_4_ = auVar8._12_4_ * fVar139;
                            auVar40._16_4_ = fVar142 * 0.0;
                            auVar40._20_4_ = fVar144 * 0.0;
                            auVar40._24_4_ = fVar146 * 0.0;
                            auVar40._28_4_ = auVar250._28_4_;
                            auVar102 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar123 = vfmadd231ps_fma(auVar40,auVar102,ZEXT1632(auVar123));
                            _local_2ca0 = *(undefined1 (*) [32])(ray + 0x80);
                            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),_local_2ca0,
                                                       ZEXT1632(auVar159));
                            _local_29c0 = vsubps_avx(_local_2c80,auVar161);
                            in_ZMM13 = ZEXT3264(auVar154);
                            local_29e0 = vsubps_avx(_local_2ba0,auVar154);
                            auVar227._0_4_ = local_2c80._0_4_ + auVar161._0_4_;
                            auVar227._4_4_ = local_2c80._4_4_ + auVar161._4_4_;
                            auVar227._8_4_ = local_2c80._8_4_ + auVar161._8_4_;
                            auVar227._12_4_ = local_2c80._12_4_ + auVar161._12_4_;
                            auVar227._16_4_ = local_2c80._16_4_ + auVar161._16_4_;
                            auVar227._20_4_ = local_2c80._20_4_ + auVar161._20_4_;
                            auVar227._24_4_ = local_2c80._24_4_ + auVar161._24_4_;
                            auVar227._28_4_ = local_2c80._28_4_ + auVar161._28_4_;
                            auVar128._0_4_ = auVar154._0_4_ + fVar83;
                            auVar128._4_4_ = auVar154._4_4_ + fVar120;
                            auVar128._8_4_ = auVar154._8_4_ + fVar98;
                            auVar128._12_4_ = auVar154._12_4_ + fVar100;
                            auVar128._16_4_ = auVar154._16_4_ + fVar97;
                            auVar128._20_4_ = auVar154._20_4_ + fVar99;
                            auVar128._24_4_ = auVar154._24_4_ + fVar101;
                            auVar128._28_4_ = auVar154._28_4_ + fVar84;
                            fVar132 = local_29e0._0_4_;
                            fVar135 = local_29e0._4_4_;
                            auVar41._4_4_ = auVar227._4_4_ * fVar135;
                            auVar41._0_4_ = auVar227._0_4_ * fVar132;
                            fVar141 = local_29e0._8_4_;
                            auVar41._8_4_ = auVar227._8_4_ * fVar141;
                            fVar145 = local_29e0._12_4_;
                            auVar41._12_4_ = auVar227._12_4_ * fVar145;
                            fVar118 = local_29e0._16_4_;
                            auVar41._16_4_ = auVar227._16_4_ * fVar118;
                            fVar122 = local_29e0._20_4_;
                            auVar41._20_4_ = auVar227._20_4_ * fVar122;
                            fVar137 = local_29e0._24_4_;
                            auVar41._24_4_ = auVar227._24_4_ * fVar137;
                            auVar41._28_4_ = fVar84;
                            auVar8 = vfmsub231ps_fma(auVar41,_local_29c0,auVar128);
                            auVar238 = vsubps_avx(_local_2cc0,auVar148);
                            in_ZMM14 = ZEXT3264(auVar238);
                            fVar174 = auVar238._0_4_;
                            fVar175 = auVar238._4_4_;
                            auVar42._4_4_ = fVar175 * auVar128._4_4_;
                            auVar42._0_4_ = fVar174 * auVar128._0_4_;
                            fVar176 = auVar238._8_4_;
                            auVar42._8_4_ = fVar176 * auVar128._8_4_;
                            fVar258 = auVar238._12_4_;
                            auVar42._12_4_ = fVar258 * auVar128._12_4_;
                            fVar261 = auVar238._16_4_;
                            auVar42._16_4_ = fVar261 * auVar128._16_4_;
                            fVar262 = auVar238._20_4_;
                            auVar42._20_4_ = fVar262 * auVar128._20_4_;
                            fVar263 = auVar238._24_4_;
                            auVar42._24_4_ = fVar263 * auVar128._24_4_;
                            auVar42._28_4_ = auVar128._28_4_;
                            auVar213._0_4_ = auVar148._0_4_ + local_2cc0._0_4_;
                            auVar213._4_4_ = auVar148._4_4_ + local_2cc0._4_4_;
                            auVar213._8_4_ = auVar148._8_4_ + local_2cc0._8_4_;
                            auVar213._12_4_ = auVar148._12_4_ + local_2cc0._12_4_;
                            auVar213._16_4_ = auVar148._16_4_ + local_2cc0._16_4_;
                            auVar213._20_4_ = auVar148._20_4_ + local_2cc0._20_4_;
                            auVar213._24_4_ = auVar148._24_4_ + local_2cc0._24_4_;
                            auVar213._28_4_ = auVar148._28_4_ + local_2cc0._28_4_;
                            auVar159 = vfmsub231ps_fma(auVar42,local_29e0,auVar213);
                            fVar84 = local_29c0._0_4_;
                            fVar138 = local_29c0._4_4_;
                            auVar43._4_4_ = auVar213._4_4_ * fVar138;
                            auVar43._0_4_ = auVar213._0_4_ * fVar84;
                            fVar143 = local_29c0._8_4_;
                            auVar43._8_4_ = auVar213._8_4_ * fVar143;
                            fVar117 = local_29c0._12_4_;
                            auVar43._12_4_ = auVar213._12_4_ * fVar117;
                            fVar119 = local_29c0._16_4_;
                            auVar43._16_4_ = auVar213._16_4_ * fVar119;
                            fVar134 = local_29c0._20_4_;
                            auVar43._20_4_ = auVar213._20_4_ * fVar134;
                            fVar140 = local_29c0._24_4_;
                            auVar43._24_4_ = auVar213._24_4_ * fVar140;
                            auVar43._28_4_ = auVar213._28_4_;
                            auVar259 = vfmsub231ps_fma(auVar43,auVar238,auVar227);
                            auVar214._0_4_ = fVar121 * auVar259._0_4_;
                            auVar214._4_4_ = fVar133 * auVar259._4_4_;
                            auVar214._8_4_ = fVar136 * auVar259._8_4_;
                            auVar214._12_4_ = fVar139 * auVar259._12_4_;
                            auVar214._16_4_ = fVar142 * 0.0;
                            auVar214._20_4_ = fVar144 * 0.0;
                            auVar214._24_4_ = fVar146 * 0.0;
                            auVar214._28_4_ = 0;
                            auVar159 = vfmadd231ps_fma(auVar214,auVar102,ZEXT1632(auVar159));
                            auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),_local_2ca0,
                                                       ZEXT1632(auVar8));
                            auVar215 = ZEXT1664(auVar159);
                            auVar110 = vsubps_avx(auVar148,auVar237);
                            auVar229 = ZEXT3264(auVar110);
                            auVar129._0_4_ = auVar148._0_4_ + auVar237._0_4_;
                            auVar129._4_4_ = auVar148._4_4_ + auVar237._4_4_;
                            auVar129._8_4_ = auVar148._8_4_ + auVar237._8_4_;
                            auVar129._12_4_ = auVar148._12_4_ + auVar237._12_4_;
                            auVar129._16_4_ = auVar148._16_4_ + auVar237._16_4_;
                            auVar129._20_4_ = auVar148._20_4_ + auVar237._20_4_;
                            auVar129._24_4_ = auVar148._24_4_ + auVar237._24_4_;
                            auVar129._28_4_ = auVar148._28_4_ + auVar237._28_4_;
                            auVar237 = vsubps_avx(auVar161,auVar91);
                            auVar201 = ZEXT3264(auVar237);
                            auVar107._0_4_ = auVar91._0_4_ + auVar161._0_4_;
                            auVar107._4_4_ = auVar91._4_4_ + auVar161._4_4_;
                            auVar107._8_4_ = auVar91._8_4_ + auVar161._8_4_;
                            auVar107._12_4_ = auVar91._12_4_ + auVar161._12_4_;
                            auVar107._16_4_ = auVar91._16_4_ + auVar161._16_4_;
                            auVar107._20_4_ = auVar91._20_4_ + auVar161._20_4_;
                            auVar107._24_4_ = auVar91._24_4_ + auVar161._24_4_;
                            auVar107._28_4_ = auVar91._28_4_ + auVar161._28_4_;
                            auVar131 = vsubps_avx(auVar154,auVar109);
                            auVar260 = ZEXT3264(auVar131);
                            auVar93._0_4_ = auVar154._0_4_ + auVar109._0_4_;
                            auVar93._4_4_ = auVar154._4_4_ + auVar109._4_4_;
                            auVar93._8_4_ = auVar154._8_4_ + auVar109._8_4_;
                            auVar93._12_4_ = auVar154._12_4_ + auVar109._12_4_;
                            auVar93._16_4_ = auVar154._16_4_ + auVar109._16_4_;
                            auVar93._20_4_ = auVar154._20_4_ + auVar109._20_4_;
                            auVar93._24_4_ = auVar154._24_4_ + auVar109._24_4_;
                            auVar93._28_4_ = auVar154._28_4_ + auVar109._28_4_;
                            auVar155._0_4_ = auVar131._0_4_ * auVar107._0_4_;
                            auVar155._4_4_ = auVar131._4_4_ * auVar107._4_4_;
                            auVar155._8_4_ = auVar131._8_4_ * auVar107._8_4_;
                            auVar155._12_4_ = auVar131._12_4_ * auVar107._12_4_;
                            auVar155._16_4_ = auVar131._16_4_ * auVar107._16_4_;
                            auVar155._20_4_ = auVar131._20_4_ * auVar107._20_4_;
                            auVar155._24_4_ = auVar131._24_4_ * auVar107._24_4_;
                            auVar155._28_4_ = 0;
                            auVar259 = vfmsub231ps_fma(auVar155,auVar237,auVar93);
                            auVar44._4_4_ = auVar110._4_4_ * auVar93._4_4_;
                            auVar44._0_4_ = auVar110._0_4_ * auVar93._0_4_;
                            auVar44._8_4_ = auVar110._8_4_ * auVar93._8_4_;
                            auVar44._12_4_ = auVar110._12_4_ * auVar93._12_4_;
                            auVar44._16_4_ = auVar110._16_4_ * auVar93._16_4_;
                            auVar44._20_4_ = auVar110._20_4_ * auVar93._20_4_;
                            auVar44._24_4_ = auVar110._24_4_ * auVar93._24_4_;
                            auVar44._28_4_ = auVar93._28_4_;
                            auVar8 = vfmsub231ps_fma(auVar44,auVar131,auVar129);
                            auVar45._4_4_ = auVar129._4_4_ * auVar237._4_4_;
                            auVar45._0_4_ = auVar129._0_4_ * auVar237._0_4_;
                            auVar45._8_4_ = auVar129._8_4_ * auVar237._8_4_;
                            auVar45._12_4_ = auVar129._12_4_ * auVar237._12_4_;
                            auVar45._16_4_ = auVar129._16_4_ * auVar237._16_4_;
                            auVar45._20_4_ = auVar129._20_4_ * auVar237._20_4_;
                            auVar45._24_4_ = auVar129._24_4_ * auVar237._24_4_;
                            auVar45._28_4_ = auVar129._28_4_;
                            auVar160 = vfmsub231ps_fma(auVar45,auVar110,auVar107);
                            auVar46._4_4_ = fVar133 * auVar160._4_4_;
                            auVar46._0_4_ = fVar121 * auVar160._0_4_;
                            auVar46._8_4_ = fVar136 * auVar160._8_4_;
                            auVar46._12_4_ = fVar139 * auVar160._12_4_;
                            auVar46._16_4_ = fVar142 * 0.0;
                            auVar46._20_4_ = fVar144 * 0.0;
                            auVar46._24_4_ = fVar146 * 0.0;
                            auVar46._28_4_ = auVar107._28_4_;
                            auVar293 = ZEXT3264(_local_2ca0);
                            auVar8 = vfmadd231ps_fma(auVar46,auVar102,ZEXT1632(auVar8));
                            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_2ca0,ZEXT1632(auVar259)
                                                    );
                            auVar170 = ZEXT1632(CONCAT412(auVar8._12_4_ +
                                                          auVar123._12_4_ + auVar159._12_4_,
                                                          CONCAT48(auVar8._8_4_ +
                                                                   auVar123._8_4_ + auVar159._8_4_,
                                                                   CONCAT44(auVar8._4_4_ +
                                                                            auVar123._4_4_ +
                                                                            auVar159._4_4_,
                                                                            auVar8._0_4_ +
                                                                            auVar123._0_4_ +
                                                                            auVar159._0_4_))));
                            auVar173 = ZEXT3264(auVar170);
                            local_2a00 = ZEXT1632(auVar123);
                            auVar91 = vminps_avx(local_2a00,ZEXT1632(auVar159));
                            auVar109 = vminps_avx(auVar91,ZEXT1632(auVar8));
                            auVar91 = vandps_avx(local_2940,auVar170);
                            auVar184 = ZEXT3264(auVar91);
                            fVar121 = auVar91._0_4_ * 1.1920929e-07;
                            fVar133 = auVar91._4_4_ * 1.1920929e-07;
                            auVar47._4_4_ = fVar133;
                            auVar47._0_4_ = fVar121;
                            fVar136 = auVar91._8_4_ * 1.1920929e-07;
                            auVar47._8_4_ = fVar136;
                            fVar139 = auVar91._12_4_ * 1.1920929e-07;
                            auVar47._12_4_ = fVar139;
                            fVar142 = auVar91._16_4_ * 1.1920929e-07;
                            auVar47._16_4_ = fVar142;
                            fVar144 = auVar91._20_4_ * 1.1920929e-07;
                            auVar47._20_4_ = fVar144;
                            fVar146 = auVar91._24_4_ * 1.1920929e-07;
                            auVar47._24_4_ = fVar146;
                            auVar47._28_4_ = 0x34000000;
                            auVar156._0_4_ = (uint)fVar121 ^ local_2c60._0_4_;
                            auVar156._4_4_ = (uint)fVar133 ^ local_2c60._4_4_;
                            auVar156._8_4_ = (uint)fVar136 ^ (uint)fStack_2c58;
                            auVar156._12_4_ = (uint)fVar139 ^ (uint)fStack_2c54;
                            auVar156._16_4_ = (uint)fVar142 ^ (uint)fStack_2c50;
                            auVar156._20_4_ = (uint)fVar144 ^ (uint)fStack_2c4c;
                            auVar156._24_4_ = (uint)fVar146 ^ (uint)fStack_2c48;
                            auVar156._28_4_ = (uint)fStack_2c44 ^ 0x34000000;
                            auVar109 = vcmpps_avx(auVar109,auVar156,5);
                            auVar161 = vmaxps_avx(local_2a00,ZEXT1632(auVar159));
                            auVar251 = ZEXT3264(auVar149);
                            auVar148 = vmaxps_avx(auVar161,ZEXT1632(auVar8));
                            auVar148 = vcmpps_avx(auVar148,auVar47,2);
                            auVar116 = ZEXT3264(auVar148);
                            local_2da0._0_32_ = vorps_avx(auVar109,auVar148);
                            auVar109 = auVar149 & local_2da0._0_32_;
                            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar109 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar109 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar109 >> 0x7f,0) == '\0') &&
                                  (auVar109 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar109 >> 0xbf,0) == '\0') &&
                                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar109[0x1f]) {
                              auVar241 = ZEXT3264(local_2be0);
                              auVar270 = ZEXT3264(auVar149);
                              local_2da0._0_32_ = auVar154;
                            }
                            else {
                              _local_2b80 = auVar91;
                              _local_2b60 = auVar170;
                              _local_2b40 = ZEXT1632(auVar159);
                              auVar48._4_4_ = fVar138 * local_2980._4_4_;
                              auVar48._0_4_ = fVar84 * local_2980._0_4_;
                              auVar48._8_4_ = fVar143 * local_2980._8_4_;
                              auVar48._12_4_ = fVar117 * local_2980._12_4_;
                              auVar48._16_4_ = fVar119 * local_2980._16_4_;
                              auVar48._20_4_ = fVar134 * local_2980._20_4_;
                              auVar48._24_4_ = fVar140 * local_2980._24_4_;
                              auVar48._28_4_ = local_2da0._28_4_;
                              auVar49._4_4_ = fVar175 * local_29a0._4_4_;
                              auVar49._0_4_ = fVar174 * local_29a0._0_4_;
                              auVar49._8_4_ = fVar176 * local_29a0._8_4_;
                              auVar49._12_4_ = fVar258 * local_29a0._12_4_;
                              auVar49._16_4_ = fVar261 * local_29a0._16_4_;
                              auVar49._20_4_ = fVar262 * local_29a0._20_4_;
                              auVar49._24_4_ = fVar263 * local_29a0._24_4_;
                              auVar49._28_4_ = auVar148._28_4_;
                              auVar8 = vfmsub213ps_fma(local_29a0,local_29e0,auVar48);
                              auVar50._4_4_ = auVar237._4_4_ * fVar135;
                              auVar50._0_4_ = auVar237._0_4_ * fVar132;
                              auVar50._8_4_ = auVar237._8_4_ * fVar141;
                              auVar50._12_4_ = auVar237._12_4_ * fVar145;
                              auVar50._16_4_ = auVar237._16_4_ * fVar118;
                              auVar50._20_4_ = auVar237._20_4_ * fVar122;
                              auVar50._24_4_ = auVar237._24_4_ * fVar137;
                              auVar50._28_4_ = 0x34000000;
                              auVar51._4_4_ = fVar175 * auVar131._4_4_;
                              auVar51._0_4_ = fVar174 * auVar131._0_4_;
                              auVar51._8_4_ = fVar176 * auVar131._8_4_;
                              auVar51._12_4_ = fVar258 * auVar131._12_4_;
                              auVar51._16_4_ = fVar261 * auVar131._16_4_;
                              auVar51._20_4_ = fVar262 * auVar131._20_4_;
                              auVar51._24_4_ = fVar263 * auVar131._24_4_;
                              auVar51._28_4_ = auVar161._28_4_;
                              auVar259 = vfmsub213ps_fma(auVar131,_local_29c0,auVar50);
                              auVar109 = vandps_avx(local_2940,auVar48);
                              auVar148 = vandps_avx(local_2940,auVar50);
                              auVar109 = vcmpps_avx(auVar109,auVar148,1);
                              auVar161 = vblendvps_avx(ZEXT1632(auVar259),ZEXT1632(auVar8),auVar109)
                              ;
                              auVar260 = ZEXT3264(auVar161);
                              auVar52._4_4_ = auVar110._4_4_ * fVar138;
                              auVar52._0_4_ = auVar110._0_4_ * fVar84;
                              auVar52._8_4_ = auVar110._8_4_ * fVar143;
                              auVar52._12_4_ = auVar110._12_4_ * fVar117;
                              auVar52._16_4_ = auVar110._16_4_ * fVar119;
                              auVar52._20_4_ = auVar110._20_4_ * fVar134;
                              auVar52._24_4_ = auVar110._24_4_ * fVar140;
                              auVar52._28_4_ = auVar109._28_4_;
                              auVar8 = vfmsub213ps_fma(auVar110,local_29e0,auVar51);
                              auVar229 = ZEXT1664(auVar8);
                              auVar53._4_4_ = local_2960._4_4_ * fVar135;
                              auVar53._0_4_ = local_2960._0_4_ * fVar132;
                              auVar53._8_4_ = local_2960._8_4_ * fVar141;
                              auVar53._12_4_ = local_2960._12_4_ * fVar145;
                              auVar53._16_4_ = local_2960._16_4_ * fVar118;
                              auVar53._20_4_ = local_2960._20_4_ * fVar122;
                              auVar53._24_4_ = local_2960._24_4_ * fVar137;
                              auVar53._28_4_ = auVar148._28_4_;
                              auVar259 = vfmsub213ps_fma(local_2980,auVar238,auVar53);
                              auVar109 = vandps_avx(local_2940,auVar53);
                              auVar148 = vandps_avx(local_2940,auVar51);
                              auVar109 = vcmpps_avx(auVar109,auVar148,1);
                              auVar154 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar259),auVar109)
                              ;
                              auVar215 = ZEXT3264(auVar154);
                              auVar8 = vfmsub213ps_fma(local_2960,_local_29c0,auVar49);
                              auVar259 = vfmsub213ps_fma(auVar237,auVar238,auVar52);
                              auVar201 = ZEXT1664(auVar259);
                              auVar109 = vandps_avx(local_2940,auVar49);
                              auVar148 = vandps_avx(local_2940,auVar52);
                              auVar109 = vcmpps_avx(auVar109,auVar148,1);
                              auVar237 = vblendvps_avx(ZEXT1632(auVar259),ZEXT1632(auVar8),auVar109)
                              ;
                              auVar184 = ZEXT3264(auVar237);
                              local_2de0._0_4_ = auVar65._0_4_;
                              local_2de0._4_4_ = auVar65._4_4_;
                              auStack_2dd8._0_4_ = auVar65._8_4_;
                              auStack_2dd8._4_4_ = auVar65._12_4_;
                              fStack_2dd0 = auVar65._16_4_;
                              fStack_2dcc = auVar65._20_4_;
                              fStack_2dc8 = auVar65._24_4_;
                              auVar54._4_4_ = auVar237._4_4_ * (float)local_2de0._4_4_;
                              auVar54._0_4_ = auVar237._0_4_ * (float)local_2de0._0_4_;
                              auVar54._8_4_ = auVar237._8_4_ * (float)auStack_2dd8._0_4_;
                              auVar54._12_4_ = auVar237._12_4_ * (float)auStack_2dd8._4_4_;
                              auVar54._16_4_ = auVar237._16_4_ * fStack_2dd0;
                              auVar54._20_4_ = auVar237._20_4_ * fStack_2dcc;
                              auVar54._24_4_ = auVar237._24_4_ * fStack_2dc8;
                              auVar54._28_4_ = auVar109._28_4_;
                              auVar8 = vfmadd213ps_fma(auVar102,auVar154,auVar54);
                              auVar259 = vfmadd213ps_fma(_local_2ca0,auVar161,ZEXT1632(auVar8));
                              auVar293 = ZEXT1664(auVar259);
                              fVar84 = auVar259._0_4_ + auVar259._0_4_;
                              fVar132 = auVar259._4_4_ + auVar259._4_4_;
                              fVar135 = auVar259._8_4_ + auVar259._8_4_;
                              fVar138 = auVar259._12_4_ + auVar259._12_4_;
                              auVar110 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar135,CONCAT44(
                                                  fVar132,fVar84))));
                              auVar108._0_4_ = auVar237._0_4_ * fVar83;
                              auVar108._4_4_ = auVar237._4_4_ * fVar120;
                              auVar108._8_4_ = auVar237._8_4_ * fVar98;
                              auVar108._12_4_ = auVar237._12_4_ * fVar100;
                              auVar108._16_4_ = auVar237._16_4_ * fVar97;
                              auVar108._20_4_ = auVar237._20_4_ * fVar99;
                              auVar108._24_4_ = auVar237._24_4_ * fVar101;
                              auVar108._28_4_ = 0;
                              auVar8 = vfmadd213ps_fma(_local_2c80,auVar154,auVar108);
                              auVar160 = vfmadd213ps_fma(_local_2cc0,auVar161,ZEXT1632(auVar8));
                              auVar109 = vrcpps_avx(auVar110);
                              auVar171._8_4_ = 0x3f800000;
                              auVar171._0_8_ = &DAT_3f8000003f800000;
                              auVar171._12_4_ = 0x3f800000;
                              auVar171._16_4_ = 0x3f800000;
                              auVar171._20_4_ = 0x3f800000;
                              auVar171._24_4_ = 0x3f800000;
                              auVar171._28_4_ = 0x3f800000;
                              auVar173 = ZEXT3264(auVar171);
                              auVar8 = vfnmadd213ps_fma(auVar109,auVar110,auVar171);
                              auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar109,auVar109);
                              auVar55._28_4_ = auVar109._28_4_;
                              auVar55._0_28_ =
                                   ZEXT1628(CONCAT412((auVar160._12_4_ + auVar160._12_4_) *
                                                      auVar8._12_4_,
                                                      CONCAT48((auVar160._8_4_ + auVar160._8_4_) *
                                                               auVar8._8_4_,
                                                               CONCAT44((auVar160._4_4_ +
                                                                        auVar160._4_4_) *
                                                                        auVar8._4_4_,
                                                                        (auVar160._0_4_ +
                                                                        auVar160._0_4_) *
                                                                        auVar8._0_4_))));
                              _local_2e00 = *(undefined1 (*) [32])(ray + 0x100);
                              in_ZMM13 = ZEXT3264(_local_2e00);
                              auVar109 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55,2);
                              auVar148 = vcmpps_avx(auVar55,_local_2e00,2);
                              auVar109 = vandps_avx(auVar109,auVar148);
                              auVar157._0_4_ = (uint)fVar84 ^ local_2c60._0_4_;
                              auVar157._4_4_ = (uint)fVar132 ^ local_2c60._4_4_;
                              auVar157._8_4_ = (uint)fVar135 ^ (uint)fStack_2c58;
                              auVar157._12_4_ = (uint)fVar138 ^ (uint)fStack_2c54;
                              auVar157._16_4_ = fStack_2c50;
                              auVar157._20_4_ = fStack_2c4c;
                              auVar157._24_4_ = fStack_2c48;
                              auVar157._28_4_ = fStack_2c44;
                              auVar148 = vcmpps_avx(auVar110,auVar157,4);
                              auVar109 = vandps_avx(auVar148,auVar109);
                              auVar148 = vandps_avx(auVar149,local_2da0._0_32_);
                              auVar109 = vpslld_avx2(auVar109,0x1f);
                              auVar110 = vpsrad_avx2(auVar109,0x1f);
                              auVar116 = ZEXT3264(auVar110);
                              auVar109 = auVar148 & auVar110;
                              auVar270 = ZEXT3264(auVar149);
                              if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar109 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar109 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar109 >> 0x7f,0) == '\0')
                                    && (auVar109 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar109 >> 0xbf,0) == '\0')
                                  && (auVar109 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar109[0x1f]) {
                                auVar241 = ZEXT3264(local_2be0);
                              }
                              else {
                                auVar109 = vandps_avx(auVar110,auVar148);
                                uVar66 = *(uint *)((long)&pRVar78[2].flags + uVar69 * 4);
                                pRVar71 = (RTCIntersectArguments *)
                                          (context->scene->geometries).items;
                                auVar75 = *(undefined1 (*) [8])
                                           ((long)&pRVar71->flags + (ulong)uVar66 * 8);
                                uVar81 = ((Geometry *)auVar75)->mask;
                                auVar111._4_4_ = uVar81;
                                auVar111._0_4_ = uVar81;
                                auVar111._8_4_ = uVar81;
                                auVar111._12_4_ = uVar81;
                                auVar111._16_4_ = uVar81;
                                auVar111._20_4_ = uVar81;
                                auVar111._24_4_ = uVar81;
                                auVar111._28_4_ = uVar81;
                                auVar148 = vpand_avx2(auVar111,*(undefined1 (*) [32])(ray + 0x120));
                                auVar110 = vpcmpeqd_avx2(auVar148,_DAT_02020f00);
                                auVar116 = ZEXT3264(auVar110);
                                auVar148 = auVar109 & ~auVar110;
                                auVar241 = ZEXT3264(local_2be0);
                                if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar148 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar148 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar148 >> 0x7f,0) != '\0'
                                       ) || (auVar148 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar148 >> 0xbf,0) != '\0') ||
                                    (auVar148 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar148[0x1f] < '\0') {
                                  uVar70 = *(undefined4 *)((long)&pRVar78[2].filter + uVar69 * 4);
                                  pRVar71 = (RTCIntersectArguments *)0x0;
                                  auVar109 = vandnps_avx(auVar110,auVar109);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (((Geometry *)auVar75)->occlusionFilterN !=
                                      (RTCFilterFunctionN)0x0)) {
                                    auVar148 = vrcpps_avx(auVar170);
                                    auVar200._8_4_ = 0x3f800000;
                                    auVar200._0_8_ = &DAT_3f8000003f800000;
                                    auVar200._12_4_ = 0x3f800000;
                                    auVar200._16_4_ = 0x3f800000;
                                    auVar200._20_4_ = 0x3f800000;
                                    auVar200._24_4_ = 0x3f800000;
                                    auVar200._28_4_ = 0x3f800000;
                                    auVar8 = vfnmadd213ps_fma(auVar170,auVar148,auVar200);
                                    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar148,auVar148);
                                    auVar95._8_4_ = 0x219392ef;
                                    auVar95._0_8_ = 0x219392ef219392ef;
                                    auVar95._12_4_ = 0x219392ef;
                                    auVar95._16_4_ = 0x219392ef;
                                    auVar95._20_4_ = 0x219392ef;
                                    auVar95._24_4_ = 0x219392ef;
                                    auVar95._28_4_ = 0x219392ef;
                                    auVar148 = vcmpps_avx(auVar91,auVar95,5);
                                    auVar148 = vandps_avx(auVar148,ZEXT1632(auVar8));
                                    auVar58._4_4_ = auVar148._4_4_ * auVar123._4_4_;
                                    auVar58._0_4_ = auVar148._0_4_ * auVar123._0_4_;
                                    auVar58._8_4_ = auVar148._8_4_ * auVar123._8_4_;
                                    auVar58._12_4_ = auVar148._12_4_ * auVar123._12_4_;
                                    auVar58._16_4_ = auVar148._16_4_ * 0.0;
                                    auVar58._20_4_ = auVar148._20_4_ * 0.0;
                                    auVar58._24_4_ = auVar148._24_4_ * 0.0;
                                    auVar58._28_4_ = auVar91._28_4_;
                                    auVar91 = vminps_avx(auVar58,auVar200);
                                    auVar59._4_4_ = auVar148._4_4_ * auVar159._4_4_;
                                    auVar59._0_4_ = auVar148._0_4_ * auVar159._0_4_;
                                    auVar59._8_4_ = auVar148._8_4_ * auVar159._8_4_;
                                    auVar59._12_4_ = auVar148._12_4_ * auVar159._12_4_;
                                    auVar59._16_4_ = auVar148._16_4_ * 0.0;
                                    auVar59._20_4_ = auVar148._20_4_ * 0.0;
                                    auVar59._24_4_ = auVar148._24_4_ * 0.0;
                                    auVar59._28_4_ = auVar148._28_4_;
                                    auVar148 = vminps_avx(auVar59,auVar200);
                                    auVar110 = vsubps_avx(auVar200,auVar91);
                                    auVar131 = vsubps_avx(auVar200,auVar148);
                                    auVar8._8_8_ = uStack_2758;
                                    auVar8._0_8_ = local_2760;
                                    auVar63._16_8_ = uStack_2750;
                                    auVar63._0_16_ = auVar8;
                                    auVar63._24_8_ = uStack_2748;
                                    auVar229 = ZEXT3264(auVar63);
                                    auVar91 = vblendvps_avx(auVar91,auVar110,auVar63);
                                    local_2aa0 = vblendvps_avx(auVar148,auVar131,auVar63);
                                    pRVar5 = context->user;
                                    auVar160._4_4_ = uVar66;
                                    auVar160._0_4_ = uVar66;
                                    auVar160._8_4_ = uVar66;
                                    auVar160._12_4_ = uVar66;
                                    local_2a60._16_4_ = uVar66;
                                    local_2a60._0_16_ = auVar160;
                                    local_2a60._20_4_ = uVar66;
                                    local_2a60._24_4_ = uVar66;
                                    local_2a60._28_4_ = uVar66;
                                    auVar173 = ZEXT3264(local_2a60);
                                    auVar192._4_4_ = uVar70;
                                    auVar192._0_4_ = uVar70;
                                    auVar192._8_4_ = uVar70;
                                    auVar192._12_4_ = uVar70;
                                    local_2a80._16_4_ = uVar70;
                                    local_2a80._0_16_ = auVar192;
                                    local_2a80._20_4_ = uVar70;
                                    local_2a80._24_4_ = uVar70;
                                    local_2a80._28_4_ = uVar70;
                                    auVar201 = ZEXT3264(local_2a80);
                                    _local_2b20 = auVar161;
                                    _local_2b00 = auVar154;
                                    _local_2ae0 = auVar237;
                                    local_2ac0 = auVar91;
                                    RVar6 = (RTCIntersectArguments)
                                            vpcmpeqd_avx2(local_2aa0,local_2aa0);
                                    local_2cc8[1] = RVar6;
                                    *local_2cc8 = RVar6;
                                    local_2a40.flags = pRVar5->instID[0];
                                    local_2a40.feature_mask = local_2a40.flags;
                                    local_2a40.context._0_4_ = local_2a40.flags;
                                    local_2a40.context._4_4_ = local_2a40.flags;
                                    local_2a40.filter._0_4_ = local_2a40.flags;
                                    local_2a40.filter._4_4_ = local_2a40.flags;
                                    local_2a40.intersect._0_4_ = local_2a40.flags;
                                    local_2a40.intersect._4_4_ = local_2a40.flags;
                                    local_2a20 = pRVar5->instPrimID[0];
                                    uStack_2a1c = local_2a20;
                                    uStack_2a18 = local_2a20;
                                    uStack_2a14 = local_2a20;
                                    uStack_2a10 = local_2a20;
                                    uStack_2a0c = local_2a20;
                                    uStack_2a08 = local_2a20;
                                    uStack_2a04 = local_2a20;
                                    auVar148 = vblendvps_avx(_local_2e00,auVar55,auVar109);
                                    *(undefined1 (*) [32])(ray + 0x100) = auVar148;
                                    local_2d60 = auVar109;
                                    local_2d40 = (undefined1  [8])local_2d60;
                                    uStack_2d38 = ((Geometry *)auVar75)->userPtr;
                                    uStack_2d30 = context->user;
                                    pRStack_2d28 = ray;
                                    local_2d20 = (RTCHitN *)local_2b20;
                                    fStack_2d18 = 1.12104e-44;
                                    _local_2de0 = auVar96;
                                    if (((Geometry *)auVar75)->occlusionFilterN !=
                                        (RTCFilterFunctionN)0x0) {
                                      local_2da0._0_8_ = pRVar78;
                                      _auStack_2dd8 = auVar96._8_24_;
                                      local_2de0 = auVar75;
                                      auVar173 = ZEXT1664(auVar160);
                                      auVar184 = ZEXT1664(auVar237._0_16_);
                                      auVar201 = ZEXT1664(auVar192);
                                      auVar215 = ZEXT1664(auVar154._0_16_);
                                      auVar229 = ZEXT1664(auVar8);
                                      auVar251 = ZEXT1664(auVar149._0_16_);
                                      auVar260 = ZEXT1664(auVar161._0_16_);
                                      in_ZMM14 = ZEXT1664(auVar238._0_16_);
                                      auVar293 = ZEXT1664(auVar259);
                                      (*((Geometry *)auVar75)->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)local_2d40);
                                      auVar241._8_56_ = extraout_var_00;
                                      auVar241._0_8_ = extraout_XMM1_Qa_00;
                                      auVar91 = auVar241._0_32_;
                                      in_ZMM13 = ZEXT3264(_local_2e00);
                                      auVar241 = ZEXT3264(local_2be0);
                                      auVar75 = local_2de0;
                                      pRVar78 = (RTCIntersectArguments *)local_2da0._0_8_;
                                      auVar102 = _local_2e00;
                                    }
                                    _local_2e00 = auVar102;
                                    auVar109 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2d60
                                                            );
                                    auVar114 = vpcmpeqd_avx2(auVar91,auVar91);
                                    auVar149 = auVar114 & ~auVar109;
                                    if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar149 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar149 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar149 >> 0x7f,0) == '\0') &&
                                          (auVar149 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar149 >> 0xbf,0) == '\0') &&
                                        (auVar149 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar149[0x1f]) {
                                      auVar109 = auVar109 ^ auVar114;
                                    }
                                    else {
                                      pRVar71 = context->args;
                                      if ((pRVar71->filter != (RTCFilterFunctionN)0x0) &&
                                         ((((ulong)*(Geometry **)&pRVar71->flags & 2) != 0 ||
                                          (((((Geometry *)auVar75)->field_8).field_0x2 & 0x40) != 0)
                                          ))) {
                                        local_2da0._0_8_ = pRVar78;
                                        _local_2e00 = in_ZMM13._0_32_;
                                        auVar173 = ZEXT1664(auVar173._0_16_);
                                        auVar184 = ZEXT1664(auVar184._0_16_);
                                        auVar201 = ZEXT1664(auVar201._0_16_);
                                        auVar215 = ZEXT1664(auVar215._0_16_);
                                        auVar229 = ZEXT1664(auVar229._0_16_);
                                        auVar251 = ZEXT1664(auVar251._0_16_);
                                        auVar260 = ZEXT1664(auVar260._0_16_);
                                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                        auVar293 = ZEXT1664(auVar293._0_16_);
                                        (*pRVar71->filter)((RTCFilterFunctionNArguments *)local_2d40
                                                          );
                                        in_ZMM13 = ZEXT3264(_local_2e00);
                                        auVar241 = ZEXT3264(local_2be0);
                                        pRVar78 = (RTCIntersectArguments *)local_2da0._0_8_;
                                      }
                                      auVar149 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])
                                                                                0x0),0),local_2d60);
                                      auVar109 = auVar149 ^ _DAT_0205a980;
                                      auVar114._8_4_ = 0xff800000;
                                      auVar114._0_8_ = 0xff800000ff800000;
                                      auVar114._12_4_ = 0xff800000;
                                      auVar114._16_4_ = 0xff800000;
                                      auVar114._20_4_ = 0xff800000;
                                      auVar114._24_4_ = 0xff800000;
                                      auVar114._28_4_ = 0xff800000;
                                      auVar149 = vblendvps_avx(auVar114,*(undefined1 (*) [32])
                                                                         (pRStack_2d28 + 0x100),
                                                               auVar149);
                                      *(undefined1 (*) [32])(pRStack_2d28 + 0x100) = auVar149;
                                    }
                                    auVar116 = ZEXT3264(auVar114);
                                    auVar149 = vblendvps_avx(in_ZMM13._0_32_,
                                                             *(undefined1 (*) [32])local_2d68,
                                                             auVar109);
                                    *(undefined1 (*) [32])local_2d68 = auVar149;
                                    auVar102 = _local_2e00;
                                  }
                                  _local_2e00 = auVar102;
                                  auVar149 = vandnps_avx(auVar109,local_2c40);
                                  auVar270 = ZEXT3264(auVar149);
                                  auVar102 = _local_2e00;
                                }
                              }
                            }
                            _local_2e00 = auVar102;
                            auVar149 = auVar270._0_32_;
                            bVar82 = (((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0 ||
                                          (auVar149 >> 0x3f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        SUB321(auVar149 >> 0x7f,0) != '\0') ||
                                       (auVar270 & (undefined1  [64])0x100000000) !=
                                       (undefined1  [64])0x0) || SUB321(auVar149 >> 0xbf,0) != '\0')
                                     || (auVar270 & (undefined1  [64])0x100000000) !=
                                        (undefined1  [64])0x0) || auVar270[0x1f] < '\0';
                          }
                          auVar91 = auVar270._0_32_;
                          auVar102 = auVar241._0_32_;
                          pRVar72 = pRVar71;
                          if ((!bVar82) ||
                             (bVar82 = 2 < uVar69, pRVar71 = pRVar78, uVar69 = uVar69 + 1, bVar82))
                          break;
                        }
                        auVar149 = vandps_avx(auVar91,auVar102);
                        auVar102 = auVar102 & auVar91;
                      } while (((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar102 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar102 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar102 >> 0x7f,0) != '\0') ||
                                  (auVar102 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB321(auVar102 >> 0xbf,0) != '\0') ||
                                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar102[0x1f] < '\0') &&
                              (uVar69 = local_2bf8 + 1, uVar69 < local_2c00));
                      auVar102 = vpcmpeqd_avx2(auVar116._0_32_,auVar116._0_32_);
                      auVar116 = ZEXT3264(auVar102);
                      auVar96._0_4_ = auVar149._0_4_ ^ auVar102._0_4_;
                      auVar96._4_4_ = auVar149._4_4_ ^ auVar102._4_4_;
                      auVar96._8_4_ = auVar149._8_4_ ^ auVar102._8_4_;
                      auVar96._12_4_ = auVar149._12_4_ ^ auVar102._12_4_;
                      auVar96._16_4_ = auVar149._16_4_ ^ auVar102._16_4_;
                      auVar96._20_4_ = auVar149._20_4_ ^ auVar102._20_4_;
                      auVar96._24_4_ = auVar149._24_4_ ^ auVar102._24_4_;
                      auVar96._28_4_ = auVar149._28_4_ ^ auVar102._28_4_;
                    }
                    local_2bc0 = vorps_avx(auVar96,local_2bc0);
                    auVar149 = auVar116._0_32_ & ~local_2bc0;
                    if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar149 >> 0x7f,0) == '\0') &&
                          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar149 >> 0xbf,0) == '\0') &&
                        (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar149[0x1f]) goto LAB_005bc719;
                    auVar116 = ZEXT3264(local_2780);
                    auVar130._8_4_ = 0xff800000;
                    auVar130._0_8_ = 0xff800000ff800000;
                    auVar130._12_4_ = 0xff800000;
                    auVar130._16_4_ = 0xff800000;
                    auVar130._20_4_ = 0xff800000;
                    auVar130._24_4_ = 0xff800000;
                    auVar130._28_4_ = 0xff800000;
                    local_2780 = vblendvps_avx(local_2780,auVar130,local_2bc0);
                    iVar67 = 0;
                    break;
                  }
                  goto LAB_005bc72a;
                }
                uVar68 = root.ptr & 0xfffffffffffffff0;
                auVar149 = vcmpps_avx(local_2780,auVar293._0_32_,6);
                auVar293 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar69 = 0;
                root.ptr = 8;
                do {
                  uVar73 = *(ulong *)(uVar68 + uVar69 * 8);
                  if (uVar73 != 8) {
                    uVar70 = *(undefined4 *)(uVar68 + 0x80 + uVar69 * 4);
                    auVar124._4_4_ = uVar70;
                    auVar124._0_4_ = uVar70;
                    auVar124._8_4_ = uVar70;
                    auVar124._12_4_ = uVar70;
                    auVar124._16_4_ = uVar70;
                    auVar124._20_4_ = uVar70;
                    auVar124._24_4_ = uVar70;
                    auVar124._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0x20 + uVar69 * 4);
                    auVar150._4_4_ = uVar70;
                    auVar150._0_4_ = uVar70;
                    auVar150._8_4_ = uVar70;
                    auVar150._12_4_ = uVar70;
                    auVar150._16_4_ = uVar70;
                    auVar150._20_4_ = uVar70;
                    auVar150._24_4_ = uVar70;
                    auVar150._28_4_ = uVar70;
                    auVar102 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar70 = *(undefined4 *)(uVar68 + 0xa0 + uVar69 * 4);
                    auVar162._4_4_ = uVar70;
                    auVar162._0_4_ = uVar70;
                    auVar162._8_4_ = uVar70;
                    auVar162._12_4_ = uVar70;
                    auVar162._16_4_ = uVar70;
                    auVar162._20_4_ = uVar70;
                    auVar162._24_4_ = uVar70;
                    auVar162._28_4_ = uVar70;
                    auVar123 = vfmadd231ps_fma(auVar150,auVar102,auVar124);
                    uVar70 = *(undefined4 *)(uVar68 + 0x40 + uVar69 * 4);
                    auVar125._4_4_ = uVar70;
                    auVar125._0_4_ = uVar70;
                    auVar125._8_4_ = uVar70;
                    auVar125._12_4_ = uVar70;
                    auVar125._16_4_ = uVar70;
                    auVar125._20_4_ = uVar70;
                    auVar125._24_4_ = uVar70;
                    auVar125._28_4_ = uVar70;
                    auVar159 = vfmadd231ps_fma(auVar125,auVar102,auVar162);
                    uVar70 = *(undefined4 *)(uVar68 + 0xc0 + uVar69 * 4);
                    auVar163._4_4_ = uVar70;
                    auVar163._0_4_ = uVar70;
                    auVar163._8_4_ = uVar70;
                    auVar163._12_4_ = uVar70;
                    auVar163._16_4_ = uVar70;
                    auVar163._20_4_ = uVar70;
                    auVar163._24_4_ = uVar70;
                    auVar163._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0x60 + uVar69 * 4);
                    auVar178._4_4_ = uVar70;
                    auVar178._0_4_ = uVar70;
                    auVar178._8_4_ = uVar70;
                    auVar178._12_4_ = uVar70;
                    auVar178._16_4_ = uVar70;
                    auVar178._20_4_ = uVar70;
                    auVar178._24_4_ = uVar70;
                    auVar178._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0x90 + uVar69 * 4);
                    auVar193._4_4_ = uVar70;
                    auVar193._0_4_ = uVar70;
                    auVar193._8_4_ = uVar70;
                    auVar193._12_4_ = uVar70;
                    auVar193._16_4_ = uVar70;
                    auVar193._20_4_ = uVar70;
                    auVar193._24_4_ = uVar70;
                    auVar193._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0x30 + uVar69 * 4);
                    auVar209._4_4_ = uVar70;
                    auVar209._0_4_ = uVar70;
                    auVar209._8_4_ = uVar70;
                    auVar209._12_4_ = uVar70;
                    auVar209._16_4_ = uVar70;
                    auVar209._20_4_ = uVar70;
                    auVar209._24_4_ = uVar70;
                    auVar209._28_4_ = uVar70;
                    auVar8 = vfmadd231ps_fma(auVar178,auVar102,auVar163);
                    auVar259 = vfmadd231ps_fma(auVar209,auVar102,auVar193);
                    uVar70 = *(undefined4 *)(uVar68 + 0xb0 + uVar69 * 4);
                    auVar164._4_4_ = uVar70;
                    auVar164._0_4_ = uVar70;
                    auVar164._8_4_ = uVar70;
                    auVar164._12_4_ = uVar70;
                    auVar164._16_4_ = uVar70;
                    auVar164._20_4_ = uVar70;
                    auVar164._24_4_ = uVar70;
                    auVar164._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0x50 + uVar69 * 4);
                    auVar194._4_4_ = uVar70;
                    auVar194._0_4_ = uVar70;
                    auVar194._8_4_ = uVar70;
                    auVar194._12_4_ = uVar70;
                    auVar194._16_4_ = uVar70;
                    auVar194._20_4_ = uVar70;
                    auVar194._24_4_ = uVar70;
                    auVar194._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar68 + 0xd0 + uVar69 * 4);
                    auVar223._4_4_ = uVar70;
                    auVar223._0_4_ = uVar70;
                    auVar223._8_4_ = uVar70;
                    auVar223._12_4_ = uVar70;
                    auVar223._16_4_ = uVar70;
                    auVar223._20_4_ = uVar70;
                    auVar223._24_4_ = uVar70;
                    auVar223._28_4_ = uVar70;
                    auVar160 = vfmadd231ps_fma(auVar194,auVar102,auVar164);
                    uVar70 = *(undefined4 *)(uVar68 + 0x70 + uVar69 * 4);
                    auVar165._4_4_ = uVar70;
                    auVar165._0_4_ = uVar70;
                    auVar165._8_4_ = uVar70;
                    auVar165._12_4_ = uVar70;
                    auVar165._16_4_ = uVar70;
                    auVar165._20_4_ = uVar70;
                    auVar165._24_4_ = uVar70;
                    auVar165._28_4_ = uVar70;
                    auVar192 = vfmadd231ps_fma(auVar165,auVar102,auVar223);
                    auVar60._8_8_ = local_2920._8_8_;
                    auVar60._0_8_ = local_2920._0_8_;
                    auVar60._16_8_ = local_2920._16_8_;
                    auVar60._24_8_ = local_2920._24_8_;
                    auVar229 = ZEXT3264(auVar60);
                    auVar61._8_8_ = local_2920._40_8_;
                    auVar61._0_8_ = local_2920._32_8_;
                    auVar61._16_8_ = local_2920._48_8_;
                    auVar61._24_8_ = local_2920._56_8_;
                    auVar62._8_8_ = local_2920._72_8_;
                    auVar62._0_8_ = local_2920._64_8_;
                    auVar62._16_8_ = local_2920._80_8_;
                    auVar62._24_8_ = local_2920._88_8_;
                    auVar251 = ZEXT3264(auVar62);
                    auVar260 = ZEXT3264(local_2860);
                    auVar91 = vsubps_avx(ZEXT1632(auVar123),auVar60);
                    auVar9._4_4_ = local_2860._4_4_ * auVar91._4_4_;
                    auVar9._0_4_ = local_2860._0_4_ * auVar91._0_4_;
                    auVar9._8_4_ = local_2860._8_4_ * auVar91._8_4_;
                    auVar9._12_4_ = local_2860._12_4_ * auVar91._12_4_;
                    auVar9._16_4_ = local_2860._16_4_ * auVar91._16_4_;
                    auVar9._20_4_ = local_2860._20_4_ * auVar91._20_4_;
                    auVar9._24_4_ = local_2860._24_4_ * auVar91._24_4_;
                    auVar9._28_4_ = auVar91._28_4_;
                    auVar91 = vsubps_avx(ZEXT1632(auVar159),auVar61);
                    auVar270._0_4_ = (float)local_2840._0_4_ * auVar91._0_4_;
                    auVar270._4_4_ = (float)local_2840._4_4_ * auVar91._4_4_;
                    auVar270._8_4_ = fStack_2838 * auVar91._8_4_;
                    auVar270._12_4_ = fStack_2834 * auVar91._12_4_;
                    auVar270._16_4_ = fStack_2830 * auVar91._16_4_;
                    auVar270._20_4_ = fStack_282c * auVar91._20_4_;
                    auVar270._28_36_ = in_ZMM13._28_36_;
                    auVar270._24_4_ = fStack_2828 * auVar91._24_4_;
                    auVar148 = auVar270._0_32_;
                    in_ZMM13 = ZEXT3264(auVar148);
                    auVar91 = vsubps_avx(ZEXT1632(auVar8),auVar62);
                    auVar285._0_4_ = auVar91._0_4_ * (float)local_2820._0_4_;
                    auVar285._4_4_ = auVar91._4_4_ * (float)local_2820._4_4_;
                    auVar285._8_4_ = auVar91._8_4_ * fStack_2818;
                    auVar285._12_4_ = auVar91._12_4_ * fStack_2814;
                    auVar285._16_4_ = auVar91._16_4_ * fStack_2810;
                    auVar285._20_4_ = auVar91._20_4_ * fStack_280c;
                    auVar285._28_36_ = in_ZMM14._28_36_;
                    auVar285._24_4_ = auVar91._24_4_ * fStack_2808;
                    auVar161 = auVar285._0_32_;
                    in_ZMM14 = ZEXT3264(auVar161);
                    auVar91 = vsubps_avx(ZEXT1632(auVar259),auVar60);
                    auVar210._0_4_ = local_2860._0_4_ * auVar91._0_4_;
                    auVar210._4_4_ = local_2860._4_4_ * auVar91._4_4_;
                    auVar210._8_4_ = local_2860._8_4_ * auVar91._8_4_;
                    auVar210._12_4_ = local_2860._12_4_ * auVar91._12_4_;
                    auVar210._16_4_ = local_2860._16_4_ * auVar91._16_4_;
                    auVar210._20_4_ = local_2860._20_4_ * auVar91._20_4_;
                    auVar210._24_4_ = local_2860._24_4_ * auVar91._24_4_;
                    auVar210._28_4_ = 0;
                    auVar215 = ZEXT3264(auVar210);
                    auVar91 = vsubps_avx(ZEXT1632(auVar160),auVar61);
                    auVar195._0_4_ = (float)local_2840._0_4_ * auVar91._0_4_;
                    auVar195._4_4_ = (float)local_2840._4_4_ * auVar91._4_4_;
                    auVar195._8_4_ = fStack_2838 * auVar91._8_4_;
                    auVar195._12_4_ = fStack_2834 * auVar91._12_4_;
                    auVar195._16_4_ = fStack_2830 * auVar91._16_4_;
                    auVar195._20_4_ = fStack_282c * auVar91._20_4_;
                    auVar195._24_4_ = fStack_2828 * auVar91._24_4_;
                    auVar195._28_4_ = 0;
                    auVar201 = ZEXT3264(auVar195);
                    auVar91 = vsubps_avx(ZEXT1632(auVar192),auVar62);
                    auVar166._0_4_ = auVar91._0_4_ * (float)local_2820._0_4_;
                    auVar166._4_4_ = auVar91._4_4_ * (float)local_2820._4_4_;
                    auVar166._8_4_ = auVar91._8_4_ * fStack_2818;
                    auVar166._12_4_ = auVar91._12_4_ * fStack_2814;
                    auVar166._16_4_ = auVar91._16_4_ * fStack_2810;
                    auVar166._20_4_ = auVar91._20_4_ * fStack_280c;
                    auVar166._24_4_ = auVar91._24_4_ * fStack_2808;
                    auVar166._28_4_ = 0;
                    auVar91 = vpminsd_avx2(auVar9,auVar210);
                    auVar109 = vpminsd_avx2(auVar148,auVar195);
                    auVar91 = vpmaxsd_avx2(auVar91,auVar109);
                    auVar109 = vpminsd_avx2(auVar161,auVar166);
                    auVar91 = vpmaxsd_avx2(auVar91,auVar109);
                    auVar10._4_4_ = auVar91._4_4_ * 0.99999964;
                    auVar10._0_4_ = auVar91._0_4_ * 0.99999964;
                    auVar10._8_4_ = auVar91._8_4_ * 0.99999964;
                    auVar10._12_4_ = auVar91._12_4_ * 0.99999964;
                    auVar10._16_4_ = auVar91._16_4_ * 0.99999964;
                    auVar10._20_4_ = auVar91._20_4_ * 0.99999964;
                    auVar10._24_4_ = auVar91._24_4_ * 0.99999964;
                    auVar10._28_4_ = auVar91._28_4_;
                    auVar91 = vpmaxsd_avx2(auVar9,auVar210);
                    auVar179 = vpmaxsd_avx2(auVar148,auVar195);
                    auVar109 = vpminsd_avx2(auVar91,auVar179);
                    auVar91 = vpmaxsd_avx2(auVar161,auVar166);
                    auVar91 = vpminsd_avx2(auVar109,auVar91);
                    auVar11._4_4_ = auVar91._4_4_ * 1.0000004;
                    auVar11._0_4_ = auVar91._0_4_ * 1.0000004;
                    auVar11._8_4_ = auVar91._8_4_ * 1.0000004;
                    auVar11._12_4_ = auVar91._12_4_ * 1.0000004;
                    auVar11._16_4_ = auVar91._16_4_ * 1.0000004;
                    auVar11._20_4_ = auVar91._20_4_ * 1.0000004;
                    auVar11._24_4_ = auVar91._24_4_ * 1.0000004;
                    auVar11._28_4_ = auVar91._28_4_;
                    auVar109 = vpmaxsd_avx2(auVar10,local_27a0);
                    auVar91 = vpminsd_avx2(auVar11,local_2780);
                    auVar91 = vcmpps_avx(auVar109,auVar91,2);
                    if ((uVar81 & 7) == 6) {
                      uVar70 = *(undefined4 *)(uVar68 + 0xe0 + uVar69 * 4);
                      auVar167._4_4_ = uVar70;
                      auVar167._0_4_ = uVar70;
                      auVar167._8_4_ = uVar70;
                      auVar167._12_4_ = uVar70;
                      auVar167._16_4_ = uVar70;
                      auVar167._20_4_ = uVar70;
                      auVar167._24_4_ = uVar70;
                      auVar167._28_4_ = uVar70;
                      auVar109 = vcmpps_avx(auVar167,auVar102,2);
                      uVar70 = *(undefined4 *)(uVar68 + 0xf0 + uVar69 * 4);
                      auVar179._4_4_ = uVar70;
                      auVar179._0_4_ = uVar70;
                      auVar179._8_4_ = uVar70;
                      auVar179._12_4_ = uVar70;
                      auVar179._16_4_ = uVar70;
                      auVar179._20_4_ = uVar70;
                      auVar179._24_4_ = uVar70;
                      auVar179._28_4_ = uVar70;
                      auVar102 = vcmpps_avx(auVar102,auVar179,1);
                      auVar102 = vandps_avx(auVar109,auVar102);
                      auVar102 = vandps_avx(auVar102,auVar91);
                      auVar123 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
                    }
                    else {
                      auVar123 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
                    }
                    auVar184 = ZEXT3264(auVar179);
                    auVar173 = ZEXT3264(auVar109);
                    auVar159 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
                    auVar123 = vpand_avx(auVar123,auVar159);
                    auVar102 = vpmovzxwd_avx2(auVar123);
                    auVar102 = vpslld_avx2(auVar102,0x1f);
                    auVar116 = ZEXT3264(auVar102);
                    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar102 >> 0x7f,0) != '\0') ||
                          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar102 >> 0xbf,0) != '\0') ||
                        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar102[0x1f] < '\0') {
                      auVar151._8_4_ = 0x7f800000;
                      auVar151._0_8_ = 0x7f8000007f800000;
                      auVar151._12_4_ = 0x7f800000;
                      auVar151._16_4_ = 0x7f800000;
                      auVar151._20_4_ = 0x7f800000;
                      auVar151._24_4_ = 0x7f800000;
                      auVar151._28_4_ = 0x7f800000;
                      auVar102 = vblendvps_avx(auVar151,auVar10,auVar102);
                      auVar116 = ZEXT3264(auVar102);
                      if (root.ptr != 8) {
                        *puVar80 = root.ptr;
                        puVar80 = puVar80 + 1;
                        *pauVar74 = auVar293._0_32_;
                        pauVar74 = pauVar74 + 1;
                      }
                      auVar293 = ZEXT3264(auVar102);
                      root.ptr = uVar73;
                    }
                  }
                } while ((uVar73 != 8) && (bVar82 = uVar69 < 3, uVar69 = uVar69 + 1, bVar82));
                iVar67 = 0;
                if (root.ptr == 8) {
LAB_005bb19f:
                  pRVar72 = (RTCIntersectArguments *)0x0;
                  iVar67 = 4;
                }
                else {
                  auVar149 = vcmpps_avx(local_2780,auVar293._0_32_,6);
                  uVar70 = vmovmskps_avx(auVar149);
                  pRVar72 = (RTCIntersectArguments *)0x1;
                  if ((uint)POPCOUNT(uVar70) <= uVar79) {
                    *puVar80 = root.ptr;
                    puVar80 = puVar80 + 1;
                    *pauVar74 = auVar293._0_32_;
                    pauVar74 = pauVar74 + 1;
                    goto LAB_005bb19f;
                  }
                }
              } while ((char)pRVar72 != '\0');
            }
          }
        }
      } while (iVar67 != 3);
      auVar149 = vandps_avx(local_2720,local_2bc0);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar149 = vmaskmovps_avx(auVar149,auVar115);
      *(undefined1 (*) [32])local_2d68 = auVar149;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }